

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O1

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* GetDefaultMap_abi_cxx11_(void)

{
  pointer pbVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *in_RDI;
  pointer pbVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> chr;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  es;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  is;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ns;
  allocator<char> local_1c11;
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_1c10;
  undefined1 local_1c08 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c00;
  pointer local_1bf8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1bf0;
  long *local_1be0;
  long local_1bd8;
  long local_1bd0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1bc0;
  long local_1bb0;
  undefined1 local_1ba8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1ba0;
  pointer local_1b98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b90;
  pointer *local_1b80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b60;
  undefined1 local_1b50 [16];
  undefined1 *local_1b40 [2];
  undefined1 local_1b30 [16];
  undefined1 *local_1b20 [2];
  undefined1 local_1b10 [16];
  undefined1 *local_1b00 [2];
  undefined1 local_1af0 [16];
  undefined1 *local_1ae0 [2];
  undefined1 local_1ad0 [16];
  undefined1 *local_1ac0 [2];
  undefined1 local_1ab0 [16];
  undefined1 *local_1aa0 [2];
  undefined1 local_1a90 [16];
  undefined1 *local_1a80 [2];
  undefined1 local_1a70 [16];
  undefined1 *local_1a60 [2];
  undefined1 local_1a50 [16];
  undefined1 *local_1a40 [2];
  undefined1 local_1a30 [16];
  undefined1 *local_1a20 [2];
  undefined1 local_1a10 [16];
  undefined1 *local_1a00 [2];
  undefined1 local_19f0 [16];
  undefined1 *local_19e0 [2];
  undefined1 local_19d0 [16];
  undefined1 *local_19c0 [2];
  undefined1 local_19b0 [16];
  undefined1 *local_19a0 [2];
  undefined1 local_1990 [16];
  undefined1 *local_1980 [2];
  undefined1 local_1970 [16];
  undefined1 *local_1960 [2];
  undefined1 local_1950 [16];
  undefined1 *local_1940 [2];
  undefined1 local_1930 [16];
  undefined1 *local_1920 [2];
  undefined1 local_1910 [16];
  undefined1 *local_1900 [2];
  undefined1 local_18f0 [16];
  undefined1 *local_18e0 [2];
  undefined1 local_18d0 [16];
  undefined1 *local_18c0 [2];
  undefined1 local_18b0 [16];
  undefined1 *local_18a0 [2];
  undefined1 local_1890 [16];
  undefined1 *local_1880 [2];
  undefined1 local_1870 [16];
  undefined1 *local_1860 [2];
  undefined1 local_1850 [16];
  undefined1 *local_1840 [2];
  undefined1 local_1830 [16];
  undefined1 *local_1820 [2];
  undefined1 local_1810 [16];
  undefined1 *local_1800 [2];
  undefined1 local_17f0 [16];
  undefined1 *local_17e0 [2];
  undefined1 local_17d0 [16];
  undefined1 *local_17c0 [2];
  undefined1 local_17b0 [16];
  undefined1 *local_17a0 [2];
  undefined1 local_1790 [16];
  undefined1 *local_1780 [2];
  undefined1 local_1770 [16];
  undefined1 *local_1760 [2];
  undefined1 local_1750 [16];
  undefined1 *local_1740 [2];
  undefined1 local_1730 [16];
  undefined1 *local_1720 [2];
  undefined1 local_1710 [16];
  undefined1 *local_1700 [2];
  undefined1 local_16f0 [16];
  undefined1 *local_16e0 [2];
  undefined1 local_16d0 [16];
  undefined1 *local_16c0 [2];
  undefined1 local_16b0 [16];
  undefined1 *local_16a0 [2];
  undefined1 local_1690 [16];
  undefined1 *local_1680 [2];
  undefined1 local_1670 [16];
  undefined1 *local_1660 [2];
  undefined1 local_1650 [16];
  undefined1 *local_1640 [2];
  undefined1 local_1630 [16];
  undefined1 *local_1620 [2];
  undefined1 local_1610 [16];
  undefined1 *local_1600 [2];
  undefined1 local_15f0 [16];
  undefined1 *local_15e0 [2];
  undefined1 local_15d0 [16];
  undefined1 *local_15c0 [2];
  undefined1 local_15b0 [16];
  undefined1 *local_15a0 [2];
  undefined1 local_1590 [16];
  undefined1 *local_1580 [2];
  undefined1 local_1570 [16];
  undefined1 *local_1560 [2];
  undefined1 local_1550 [16];
  undefined1 *local_1540 [2];
  undefined1 local_1530 [16];
  undefined1 *local_1520 [2];
  undefined1 local_1510 [16];
  undefined1 *local_1500 [2];
  undefined1 local_14f0 [16];
  undefined1 *local_14e0 [2];
  undefined1 local_14d0 [16];
  undefined1 *local_14c0 [2];
  undefined1 local_14b0 [16];
  undefined1 *local_14a0 [2];
  undefined1 local_1490 [16];
  undefined1 *local_1480 [2];
  undefined1 local_1470 [16];
  undefined1 *local_1460 [2];
  undefined1 local_1450 [16];
  undefined1 *local_1440 [2];
  undefined1 local_1430 [16];
  undefined1 *local_1420 [2];
  undefined1 local_1410 [16];
  undefined1 *local_1400 [2];
  undefined1 local_13f0 [16];
  undefined1 *local_13e0 [2];
  undefined1 local_13d0 [16];
  undefined1 *local_13c0 [2];
  undefined1 local_13b0 [16];
  undefined1 *local_13a0 [2];
  undefined1 local_1390 [16];
  undefined1 *local_1380 [2];
  undefined1 local_1370 [16];
  undefined1 *local_1360 [2];
  undefined1 local_1350 [16];
  long *local_1340 [2];
  long local_1330 [2];
  undefined1 *local_1320 [2];
  undefined1 local_1310 [16];
  undefined1 *local_1300 [2];
  undefined1 local_12f0 [16];
  undefined1 *local_12e0 [2];
  undefined1 local_12d0 [16];
  undefined1 *local_12c0 [2];
  undefined1 local_12b0 [16];
  undefined1 *local_12a0 [2];
  undefined1 local_1290 [16];
  undefined1 *local_1280 [2];
  undefined1 local_1270 [16];
  undefined1 *local_1260 [2];
  undefined1 local_1250 [16];
  long *local_1240 [2];
  long local_1230 [2];
  undefined1 *local_1220 [2];
  undefined1 local_1210 [16];
  undefined1 *local_1200 [2];
  undefined1 local_11f0 [16];
  undefined1 *local_11e0 [2];
  undefined1 local_11d0 [16];
  undefined1 *local_11c0 [2];
  undefined1 local_11b0 [16];
  undefined1 *local_11a0 [2];
  undefined1 local_1190 [16];
  undefined1 *local_1180 [2];
  undefined1 local_1170 [16];
  undefined1 *local_1160 [2];
  undefined1 local_1150 [16];
  undefined1 *local_1140 [2];
  undefined1 local_1130 [16];
  undefined1 *local_1120 [2];
  undefined1 local_1110 [16];
  undefined1 *local_1100 [2];
  undefined1 local_10f0 [16];
  undefined1 *local_10e0 [2];
  undefined1 local_10d0 [16];
  undefined1 *local_10c0 [2];
  undefined1 local_10b0 [16];
  undefined1 *local_10a0 [2];
  undefined1 local_1090 [16];
  undefined1 *local_1080 [2];
  undefined1 local_1070 [16];
  undefined1 *local_1060 [2];
  undefined1 local_1050 [16];
  long *local_1040 [2];
  long local_1030 [2];
  undefined1 *local_1020 [2];
  undefined1 local_1010 [16];
  undefined1 *local_1000 [2];
  undefined1 local_ff0 [16];
  undefined1 *local_fe0 [2];
  undefined1 local_fd0 [16];
  undefined1 *local_fc0 [2];
  undefined1 local_fb0 [16];
  undefined1 *local_fa0 [2];
  undefined1 local_f90 [16];
  undefined1 *local_f80 [2];
  undefined1 local_f70 [16];
  undefined1 *local_f60 [2];
  undefined1 local_f50 [16];
  undefined1 *local_f40 [2];
  undefined1 local_f30 [16];
  undefined1 *local_f20 [2];
  undefined1 local_f10 [16];
  undefined1 *local_f00 [2];
  undefined1 local_ef0 [16];
  undefined1 *local_ee0 [2];
  undefined1 local_ed0 [16];
  undefined1 *local_ec0 [2];
  undefined1 local_eb0 [16];
  undefined1 *local_ea0 [2];
  undefined1 local_e90 [16];
  undefined1 *local_e80 [2];
  undefined1 local_e70 [16];
  undefined1 *local_e60 [2];
  undefined1 local_e50 [16];
  undefined1 *local_e40 [2];
  undefined1 local_e30 [16];
  undefined1 *local_e20 [2];
  undefined1 local_e10 [16];
  undefined1 *local_e00 [2];
  undefined1 local_df0 [16];
  undefined1 *local_de0 [2];
  undefined1 local_dd0 [16];
  undefined1 *local_dc0 [2];
  undefined1 local_db0 [16];
  undefined1 *local_da0 [2];
  undefined1 local_d90 [16];
  undefined1 *local_d80 [2];
  undefined1 local_d70 [16];
  undefined1 *local_d60 [2];
  undefined1 local_d50 [16];
  undefined1 *local_d40 [2];
  undefined1 local_d30 [16];
  undefined1 *local_d20 [2];
  undefined1 local_d10 [16];
  undefined1 *local_d00 [2];
  undefined1 local_cf0 [16];
  undefined1 *local_ce0 [2];
  undefined1 local_cd0 [16];
  undefined1 *local_cc0 [2];
  undefined1 local_cb0 [16];
  undefined1 *local_ca0 [2];
  undefined1 local_c90 [16];
  undefined1 *local_c80 [2];
  undefined1 local_c70 [16];
  undefined1 *local_c60 [2];
  undefined1 local_c50 [16];
  undefined1 *local_c40 [2];
  undefined1 local_c30 [16];
  undefined1 *local_c20 [2];
  undefined1 local_c10 [16];
  undefined1 *local_c00 [2];
  undefined1 local_bf0 [16];
  undefined1 *local_be0 [2];
  undefined1 local_bd0 [16];
  undefined1 *local_bc0 [2];
  undefined1 local_bb0 [16];
  undefined1 *local_ba0 [2];
  undefined1 local_b90 [16];
  undefined1 *local_b80 [2];
  undefined1 local_b70 [16];
  undefined1 *local_b60 [2];
  undefined1 local_b50 [16];
  undefined1 *local_b40 [2];
  undefined1 local_b30 [16];
  undefined1 *local_b20 [2];
  undefined1 local_b10 [16];
  long *local_b00 [2];
  long local_af0 [2];
  undefined1 *local_ae0 [2];
  undefined1 local_ad0 [16];
  undefined1 *local_ac0 [2];
  undefined1 local_ab0 [16];
  undefined1 *local_aa0 [2];
  undefined1 local_a90 [16];
  undefined1 *local_a80 [2];
  undefined1 local_a70 [16];
  undefined1 *local_a60 [2];
  undefined1 local_a50 [16];
  undefined1 *local_a40 [2];
  undefined1 local_a30 [16];
  undefined1 *local_a20 [2];
  undefined1 local_a10 [16];
  undefined1 *local_a00 [2];
  undefined1 local_9f0 [16];
  undefined1 *local_9e0 [2];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0 [2];
  undefined1 local_9b0 [16];
  undefined1 *local_9a0 [2];
  undefined1 local_990 [16];
  undefined1 *local_980 [2];
  undefined1 local_970 [16];
  undefined1 *local_960 [2];
  undefined1 local_950 [16];
  undefined1 *local_940 [2];
  undefined1 local_930 [16];
  undefined1 *local_920 [2];
  undefined1 local_910 [16];
  undefined1 *local_900 [2];
  undefined1 local_8f0 [16];
  undefined1 *local_8e0 [2];
  undefined1 local_8d0 [16];
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  undefined1 *local_8a0 [2];
  undefined1 local_890 [16];
  undefined1 *local_880 [2];
  undefined1 local_870 [16];
  undefined1 *local_860 [2];
  undefined1 local_850 [16];
  undefined1 *local_840 [2];
  undefined1 local_830 [16];
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  undefined1 *local_7c0 [2];
  undefined1 local_7b0 [16];
  undefined1 *local_7a0 [2];
  undefined1 local_790 [16];
  undefined1 *local_780 [2];
  undefined1 local_770 [16];
  undefined1 *local_760 [2];
  undefined1 local_750 [16];
  undefined1 *local_740 [2];
  undefined1 local_730 [16];
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  undefined1 *local_700 [2];
  undefined1 local_6f0 [16];
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  undefined1 *local_6c0 [2];
  undefined1 local_6b0 [16];
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined1 *local_640 [2];
  undefined1 local_630 [16];
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4c0 [2];
  undefined1 local_4b0 [16];
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 *local_480 [2];
  undefined1 local_470 [16];
  undefined1 *local_460 [2];
  undefined1 local_450 [16];
  undefined1 *local_440 [2];
  undefined1 local_430 [16];
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 *local_400 [2];
  undefined1 local_3f0 [16];
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 *local_380 [2];
  undefined1 local_370 [16];
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 *local_320 [2];
  undefined1 local_310 [16];
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined1 *local_2e0 [2];
  undefined1 local_2d0 [16];
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined1 *local_240 [2];
  undefined1 local_230 [16];
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0 [2];
  long local_d0 [2];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  local_1c08 = (undefined1  [8])0x1580da;
  local_1c00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x15633d;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1bc0,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (in_RDI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1bc0);
  if (local_1ba0 != &local_1b90) {
    operator_delete(local_1ba0,local_1b90._M_allocated_capacity + 1);
  }
  if ((long *)local_1bc0._M_allocated_capacity != &local_1bb0) {
    operator_delete((void *)local_1bc0._M_allocated_capacity,local_1bb0 + 1);
  }
  local_1c08 = (undefined1  [8])0x1580da;
  local_1c00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)anon_var_dwarf_14a14;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1bc0,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (in_RDI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1bc0);
  if (local_1ba0 != &local_1b90) {
    operator_delete(local_1ba0,local_1b90._M_allocated_capacity + 1);
  }
  if ((long *)local_1bc0._M_allocated_capacity != &local_1bb0) {
    operator_delete((void *)local_1bc0._M_allocated_capacity,local_1bb0 + 1);
  }
  local_1c08 = (undefined1  [8])0x1580da;
  local_1c00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x156349;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1bc0,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (in_RDI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1bc0);
  if (local_1ba0 != &local_1b90) {
    operator_delete(local_1ba0,local_1b90._M_allocated_capacity + 1);
  }
  if ((long *)local_1bc0._M_allocated_capacity != &local_1bb0) {
    operator_delete((void *)local_1bc0._M_allocated_capacity,local_1bb0 + 1);
  }
  local_1c08 = (undefined1  [8])0x1580da;
  local_1c00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)anon_var_dwarf_14a2a;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1bc0,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (in_RDI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1bc0);
  if (local_1ba0 != &local_1b90) {
    operator_delete(local_1ba0,local_1b90._M_allocated_capacity + 1);
  }
  if ((long *)local_1bc0._M_allocated_capacity != &local_1bb0) {
    operator_delete((void *)local_1bc0._M_allocated_capacity,local_1bb0 + 1);
  }
  local_1c08 = (undefined1  [8])0x1580da;
  local_1c00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x156351;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1bc0,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (in_RDI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1bc0);
  if (local_1ba0 != &local_1b90) {
    operator_delete(local_1ba0,local_1b90._M_allocated_capacity + 1);
  }
  if ((long *)local_1bc0._M_allocated_capacity != &local_1bb0) {
    operator_delete((void *)local_1bc0._M_allocated_capacity,local_1bb0 + 1);
  }
  local_1c08 = (undefined1  [8])0x1580da;
  local_1c00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x156355;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1bc0,(pair<const_char_*,_const_char_*> *)local_1c08);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (in_RDI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1bc0);
  if (local_1ba0 != &local_1b90) {
    operator_delete(local_1ba0,local_1b90._M_allocated_capacity + 1);
  }
  if ((long *)local_1bc0._M_allocated_capacity != &local_1bb0) {
    operator_delete((void *)local_1bc0._M_allocated_capacity,local_1bb0 + 1);
  }
  local_1bc0._M_allocated_capacity = (size_type)&local_1bb0;
  local_1c10 = in_RDI;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1bc0,anon_var_dwarf_14a4b,anon_var_dwarf_14a4b + 2);
  local_1ba0 = &local_1b90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1ba0,anon_var_dwarf_14a56,anon_var_dwarf_14a56 + 2);
  local_1b80 = &local_1b78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b80,anon_var_dwarf_14a61,anon_var_dwarf_14a61 + 2);
  local_1b60._M_allocated_capacity = (size_type)local_1b50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b60,anon_var_dwarf_14a6c,anon_var_dwarf_14a6c + 4);
  local_1b40[0] = local_1b30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b40,anon_var_dwarf_14a77,anon_var_dwarf_14a77 + 4);
  local_1b20[0] = local_1b10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b20,anon_var_dwarf_14a82,anon_var_dwarf_14a82 + 4);
  local_1b00[0] = local_1af0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b00,anon_var_dwarf_14a8d,anon_var_dwarf_14a8d + 4);
  local_1ae0[0] = local_1ad0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ae0,anon_var_dwarf_14a98,anon_var_dwarf_14a98 + 4);
  local_1ac0[0] = local_1ab0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ac0,anon_var_dwarf_14aa3,anon_var_dwarf_14aa3 + 4);
  local_1aa0[0] = local_1a90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1aa0,anon_var_dwarf_14aae,anon_var_dwarf_14aae + 4);
  local_1a80[0] = local_1a70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a80,anon_var_dwarf_14ab9,anon_var_dwarf_14ab9 + 4);
  local_1a60[0] = local_1a50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a60,anon_var_dwarf_14ac4,anon_var_dwarf_14ac4 + 4);
  local_1a40[0] = local_1a30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a40,anon_var_dwarf_14acf,anon_var_dwarf_14acf + 4);
  local_1a20[0] = local_1a10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a20,anon_var_dwarf_14ada,anon_var_dwarf_14ada + 4);
  local_1a00[0] = local_19f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a00,anon_var_dwarf_14ae5,anon_var_dwarf_14ae5 + 4);
  local_19e0[0] = local_19d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19e0,anon_var_dwarf_14af0,anon_var_dwarf_14af0 + 4);
  local_19c0[0] = local_19b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19c0,anon_var_dwarf_14afb,anon_var_dwarf_14afb + 2);
  local_19a0[0] = local_1990;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19a0,anon_var_dwarf_14b06,anon_var_dwarf_14b06 + 2);
  local_1980[0] = local_1970;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1980,anon_var_dwarf_14b11,anon_var_dwarf_14b11 + 3);
  local_1960[0] = local_1950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1960,anon_var_dwarf_14b1c,anon_var_dwarf_14b1c + 3);
  local_1940[0] = local_1930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1940,anon_var_dwarf_14b27,anon_var_dwarf_14b27 + 4);
  local_1920[0] = local_1910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1920,anon_var_dwarf_14b32,anon_var_dwarf_14b32 + 4);
  local_1900[0] = local_18f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1900,anon_var_dwarf_14b3d,anon_var_dwarf_14b3d + 4);
  local_18e0[0] = local_18d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18e0,anon_var_dwarf_14b48,anon_var_dwarf_14b48 + 4);
  local_18c0[0] = local_18b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18c0,anon_var_dwarf_14b53,anon_var_dwarf_14b53 + 4);
  local_18a0[0] = local_1890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18a0,anon_var_dwarf_14b5e,anon_var_dwarf_14b5e + 4);
  local_1880[0] = local_1870;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1880,anon_var_dwarf_14b69,anon_var_dwarf_14b69 + 4);
  local_1860[0] = local_1850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1860,anon_var_dwarf_14b74,anon_var_dwarf_14b74 + 4);
  local_1840[0] = local_1830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1840,anon_var_dwarf_14b7f,anon_var_dwarf_14b7f + 4);
  local_1820[0] = local_1810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1820,anon_var_dwarf_14b8a,anon_var_dwarf_14b8a + 4);
  local_1800[0] = local_17f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1800,anon_var_dwarf_14b95,anon_var_dwarf_14b95 + 4);
  local_17e0[0] = local_17d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17e0,anon_var_dwarf_14ba0,anon_var_dwarf_14ba0 + 4);
  local_17c0[0] = local_17b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17c0,anon_var_dwarf_14bab,anon_var_dwarf_14bab + 2);
  local_17a0[0] = local_1790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17a0,anon_var_dwarf_14bb6,anon_var_dwarf_14bb6 + 4);
  local_1780[0] = local_1770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1780,anon_var_dwarf_14bc1,anon_var_dwarf_14bc1 + 4);
  local_1760[0] = local_1750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1760,anon_var_dwarf_14bcc,anon_var_dwarf_14bcc + 4);
  local_1740[0] = local_1730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1740,anon_var_dwarf_14bd7,anon_var_dwarf_14bd7 + 4);
  local_1720[0] = local_1710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1720,anon_var_dwarf_14be2,anon_var_dwarf_14be2 + 4);
  local_1700[0] = local_16f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1700,anon_var_dwarf_14bed,anon_var_dwarf_14bed + 3);
  local_16e0[0] = local_16d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e0,anon_var_dwarf_14bf8,anon_var_dwarf_14bf8 + 2);
  local_16c0[0] = local_16b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16c0,anon_var_dwarf_14c03,anon_var_dwarf_14c03 + 2);
  local_16a0[0] = local_1690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16a0,anon_var_dwarf_14c0e,anon_var_dwarf_14c0e + 2);
  local_1680[0] = local_1670;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1680,anon_var_dwarf_14c19,anon_var_dwarf_14c19 + 2);
  local_1660[0] = local_1650;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1660,anon_var_dwarf_14c24,anon_var_dwarf_14c24 + 2);
  local_1640[0] = local_1630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1640,anon_var_dwarf_14c2f,anon_var_dwarf_14c2f + 2);
  local_1620[0] = local_1610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1620,anon_var_dwarf_14c3a,anon_var_dwarf_14c3a + 2);
  local_1600[0] = local_15f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1600,anon_var_dwarf_14bab,anon_var_dwarf_14bab + 2);
  local_15e0[0] = local_15d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15e0,anon_var_dwarf_14c45,anon_var_dwarf_14c45 + 3);
  local_15c0[0] = local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,anon_var_dwarf_14c50,anon_var_dwarf_14c50 + 3);
  local_15a0[0] = local_1590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15a0,anon_var_dwarf_14c5b,anon_var_dwarf_14c5b + 3);
  local_1580[0] = local_1570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1580,anon_var_dwarf_14c66,anon_var_dwarf_14c66 + 3);
  local_1560[0] = local_1550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1560,anon_var_dwarf_14c71,anon_var_dwarf_14c71 + 3);
  local_1540[0] = local_1530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1540,anon_var_dwarf_14c7c,anon_var_dwarf_14c7c + 3);
  local_1520[0] = local_1510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1520,anon_var_dwarf_14c87,anon_var_dwarf_14c87 + 3);
  local_1500[0] = local_14f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1500,anon_var_dwarf_14c92,anon_var_dwarf_14c92 + 3);
  local_14e0[0] = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14e0,anon_var_dwarf_14c9d,anon_var_dwarf_14c9d + 3);
  local_14c0[0] = local_14b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14c0,anon_var_dwarf_14ca8,anon_var_dwarf_14ca8 + 3);
  local_14a0[0] = local_1490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a0,anon_var_dwarf_14cb3,anon_var_dwarf_14cb3 + 3);
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1480,anon_var_dwarf_14cbe,anon_var_dwarf_14cbe + 3);
  local_1460[0] = local_1450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1460,anon_var_dwarf_14cc9,anon_var_dwarf_14cc9 + 3);
  local_1440[0] = local_1430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1440,anon_var_dwarf_14cd4,anon_var_dwarf_14cd4 + 3);
  local_1420[0] = local_1410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1420,anon_var_dwarf_14cdf,anon_var_dwarf_14cdf + 3);
  local_1400[0] = local_13f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1400,anon_var_dwarf_14cea,anon_var_dwarf_14cea + 3);
  local_13e0[0] = local_13d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e0,anon_var_dwarf_14cf5,anon_var_dwarf_14cf5 + 3);
  local_13c0[0] = local_13b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13c0,anon_var_dwarf_14d00,anon_var_dwarf_14d00 + 3);
  local_13a0[0] = local_1390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a0,anon_var_dwarf_14d0b,anon_var_dwarf_14d0b + 3);
  local_1380[0] = local_1370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1380,anon_var_dwarf_14d16,anon_var_dwarf_14d16 + 3);
  local_1360[0] = local_1350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1360,anon_var_dwarf_14d21,anon_var_dwarf_14d21 + 3);
  plVar3 = local_1330;
  local_1340[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1340,anon_var_dwarf_14d2c,anon_var_dwarf_14d2c + 3);
  local_1320[0] = local_1310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1320,anon_var_dwarf_14d37,anon_var_dwarf_14d37 + 3);
  local_1300[0] = local_12f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1300,anon_var_dwarf_14d42,anon_var_dwarf_14d42 + 3);
  local_12e0[0] = local_12d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12e0,anon_var_dwarf_14d4d,anon_var_dwarf_14d4d + 3);
  local_12c0[0] = local_12b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12c0,anon_var_dwarf_14d58,anon_var_dwarf_14d58 + 3);
  local_12a0[0] = local_1290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a0,anon_var_dwarf_14d63,anon_var_dwarf_14d63 + 3);
  local_1280[0] = local_1270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1280,anon_var_dwarf_14d6e,anon_var_dwarf_14d6e + 3);
  local_1260[0] = local_1250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1260,anon_var_dwarf_14a14,anon_var_dwarf_14a14 + 2);
  plVar6 = local_1230;
  local_1240[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1240,anon_var_dwarf_14d79,anon_var_dwarf_14d79 + 2);
  local_1220[0] = local_1210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1220,anon_var_dwarf_14d85,anon_var_dwarf_14d85 + 2);
  local_1200[0] = local_11f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1200,anon_var_dwarf_14d91,anon_var_dwarf_14d91 + 2);
  local_11e0[0] = local_11d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11e0,anon_var_dwarf_14d9d,anon_var_dwarf_14d9d + 2);
  local_11c0[0] = local_11b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11c0,anon_var_dwarf_14da9,anon_var_dwarf_14da9 + 2);
  local_11a0[0] = local_1190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11a0,anon_var_dwarf_14db5,anon_var_dwarf_14db5 + 2);
  local_1180[0] = local_1170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1180,anon_var_dwarf_14dc1,anon_var_dwarf_14dc1 + 2);
  local_1160[0] = local_1150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1160,anon_var_dwarf_14dcd,anon_var_dwarf_14dcd + 2);
  local_1140[0] = local_1130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1140,anon_var_dwarf_14dd9,anon_var_dwarf_14dd9 + 2);
  local_1120[0] = local_1110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1120,anon_var_dwarf_14de5,anon_var_dwarf_14de5 + 2);
  local_1100[0] = local_10f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1100,anon_var_dwarf_14df1,anon_var_dwarf_14df1 + 2);
  local_10e0[0] = local_10d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10e0,anon_var_dwarf_14dfd,anon_var_dwarf_14dfd + 3);
  local_10c0[0] = local_10b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10c0,anon_var_dwarf_14e09,anon_var_dwarf_14e09 + 3);
  local_10a0[0] = local_1090;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10a0,anon_var_dwarf_14e15,anon_var_dwarf_14e15 + 3);
  local_1080[0] = local_1070;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1080,anon_var_dwarf_14e21,anon_var_dwarf_14e21 + 3);
  local_1060[0] = local_1050;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1060,anon_var_dwarf_14e2d,anon_var_dwarf_14e2d + 3);
  plVar4 = local_1030;
  local_1040[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1040,anon_var_dwarf_14e39,anon_var_dwarf_14e39 + 3);
  __l._M_len = 0x5d;
  __l._M_array = (iterator)&local_1bc0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)local_1c08);
  lVar7 = -0xba0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  local_1bc0._M_allocated_capacity = (size_type)&local_1bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1bc0,anon_var_dwarf_14e45,anon_var_dwarf_14e45 + 3);
  local_1ba0 = &local_1b90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1ba0,anon_var_dwarf_16f65 + 0xb,anon_var_dwarf_16f65 + 0xc);
  local_1b80 = &local_1b78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b80,"i","");
  local_1b60._M_allocated_capacity = (size_type)local_1b50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b60,"1","");
  local_1b40[0] = local_1b30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b40,"|","");
  local_1b20[0] = local_1b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b20,"l","");
  local_1b00[0] = local_1af0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b00,"j","");
  local_1ae0[0] = local_1ad0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ae0,"!","");
  local_1ac0[0] = local_1ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ac0,"/","");
  local_1aa0[0] = local_1a90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1aa0,"\\\\","");
  local_1a80[0] = local_1a70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a80,anon_var_dwarf_14eb1,anon_var_dwarf_14eb1 + 3);
  local_1a60[0] = local_1a50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a60,anon_var_dwarf_14ebd,anon_var_dwarf_14ebd + 2);
  local_1a40[0] = local_1a30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a40,anon_var_dwarf_14ec9,anon_var_dwarf_14ec9 + 3);
  local_1a20[0] = local_1a10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a20,anon_var_dwarf_14ed5,anon_var_dwarf_14ed5 + 3);
  local_1a00[0] = local_19f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a00,anon_var_dwarf_14ee1,anon_var_dwarf_14ee1 + 3);
  local_19e0[0] = local_19d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19e0,anon_var_dwarf_14eed,anon_var_dwarf_14eed + 4);
  local_19c0[0] = local_19b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19c0,anon_var_dwarf_14ef9,anon_var_dwarf_14ef9 + 4);
  local_19a0[0] = local_1990;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19a0,anon_var_dwarf_14f05,anon_var_dwarf_14f05 + 4);
  local_1980[0] = local_1970;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1980,anon_var_dwarf_14f11,anon_var_dwarf_14f11 + 4);
  local_1960[0] = local_1950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1960,anon_var_dwarf_14f1d,anon_var_dwarf_14f1d + 4);
  local_1940[0] = local_1930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1940,anon_var_dwarf_14f29,anon_var_dwarf_14f29 + 4);
  local_1920[0] = local_1910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1920,anon_var_dwarf_14f35,anon_var_dwarf_14f35 + 4);
  local_1900[0] = local_18f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1900,anon_var_dwarf_14f41,anon_var_dwarf_14f41 + 4);
  local_18e0[0] = local_18d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18e0,anon_var_dwarf_14f4d,anon_var_dwarf_14f4d + 4);
  local_18c0[0] = local_18b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18c0,anon_var_dwarf_14f59,anon_var_dwarf_14f59 + 4);
  local_18a0[0] = local_1890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18a0,anon_var_dwarf_14f65,anon_var_dwarf_14f65 + 4);
  local_1880[0] = local_1870;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1880,anon_var_dwarf_14f71,anon_var_dwarf_14f71 + 4);
  local_1860[0] = local_1850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1860,anon_var_dwarf_14f7d,anon_var_dwarf_14f7d + 4);
  local_1840[0] = local_1830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1840,anon_var_dwarf_14f89,anon_var_dwarf_14f89 + 2);
  local_1820[0] = local_1810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1820,anon_var_dwarf_14f95,anon_var_dwarf_14f95 + 4);
  local_1800[0] = local_17f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1800,anon_var_dwarf_14fa1,anon_var_dwarf_14fa1 + 2);
  local_17e0[0] = local_17d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17e0,anon_var_dwarf_14fad,anon_var_dwarf_14fad + 2);
  local_17c0[0] = local_17b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17c0,anon_var_dwarf_14fb9,anon_var_dwarf_14fb9 + 2);
  local_17a0[0] = local_1790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17a0,anon_var_dwarf_14fc5,anon_var_dwarf_14fc5 + 3);
  local_1780[0] = local_1770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1780,anon_var_dwarf_14fd1,anon_var_dwarf_14fd1 + 2);
  local_1760[0] = local_1750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1760,anon_var_dwarf_14fdd,anon_var_dwarf_14fdd + 4);
  local_1740[0] = local_1730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1740,anon_var_dwarf_14fe9,anon_var_dwarf_14fe9 + 4);
  local_1720[0] = local_1710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1720,anon_var_dwarf_14ff5,anon_var_dwarf_14ff5 + 4);
  local_1700[0] = local_16f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1700,anon_var_dwarf_15001,anon_var_dwarf_15001 + 4);
  local_16e0[0] = local_16d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e0,anon_var_dwarf_1500d,anon_var_dwarf_1500d + 4);
  local_16c0[0] = local_16b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16c0,anon_var_dwarf_15019,anon_var_dwarf_15019 + 2);
  local_16a0[0] = local_1690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16a0,anon_var_dwarf_15025,anon_var_dwarf_15025 + 3);
  local_1680[0] = local_1670;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1680,anon_var_dwarf_15031,anon_var_dwarf_15031 + 3);
  local_1660[0] = local_1650;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1660,anon_var_dwarf_1503d,anon_var_dwarf_1503d + 2);
  local_1640[0] = local_1630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1640,anon_var_dwarf_15049,anon_var_dwarf_15049 + 3);
  local_1620[0] = local_1610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1620,anon_var_dwarf_15055,anon_var_dwarf_15055 + 3);
  local_1600[0] = local_15f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1600,anon_var_dwarf_15061,anon_var_dwarf_15061 + 2);
  local_15e0[0] = local_15d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15e0,anon_var_dwarf_1506d,anon_var_dwarf_1506d + 3);
  local_15c0[0] = local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,anon_var_dwarf_15079,anon_var_dwarf_15079 + 3);
  local_15a0[0] = local_1590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15a0,anon_var_dwarf_15085,anon_var_dwarf_15085 + 4);
  local_1580[0] = local_1570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1580,anon_var_dwarf_15091,anon_var_dwarf_15091 + 4);
  local_1560[0] = local_1550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1560,anon_var_dwarf_1509d,anon_var_dwarf_1509d + 4);
  local_1540[0] = local_1530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1540,anon_var_dwarf_150a9,anon_var_dwarf_150a9 + 4);
  local_1520[0] = local_1510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1520,anon_var_dwarf_150b5,anon_var_dwarf_150b5 + 4);
  local_1500[0] = local_14f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1500,anon_var_dwarf_150c1,anon_var_dwarf_150c1 + 4);
  local_14e0[0] = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14e0,anon_var_dwarf_150cd,anon_var_dwarf_150cd + 4);
  local_14c0[0] = local_14b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14c0,anon_var_dwarf_150d9,anon_var_dwarf_150d9 + 4);
  local_14a0[0] = local_1490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a0,anon_var_dwarf_150e5,anon_var_dwarf_150e5 + 4);
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1480,anon_var_dwarf_150f1,anon_var_dwarf_150f1 + 4);
  local_1460[0] = local_1450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1460,anon_var_dwarf_150fd,anon_var_dwarf_150fd + 4);
  local_1440[0] = local_1430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1440,anon_var_dwarf_15109,anon_var_dwarf_15109 + 4);
  local_1420[0] = local_1410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1420,anon_var_dwarf_15115,anon_var_dwarf_15115 + 4);
  local_1400[0] = local_13f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1400,anon_var_dwarf_15121,anon_var_dwarf_15121 + 2);
  local_13e0[0] = local_13d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e0,anon_var_dwarf_1512d,anon_var_dwarf_1512d + 3);
  local_13c0[0] = local_13b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13c0,anon_var_dwarf_15139,anon_var_dwarf_15139 + 3);
  local_13a0[0] = local_1390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a0,anon_var_dwarf_15145,anon_var_dwarf_15145 + 2);
  local_1380[0] = local_1370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1380,anon_var_dwarf_15151,anon_var_dwarf_15151 + 3);
  local_1360[0] = local_1350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1360,anon_var_dwarf_1515d,anon_var_dwarf_1515d + 4);
  local_1340[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1340,anon_var_dwarf_15169,anon_var_dwarf_15169 + 4);
  local_1320[0] = local_1310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1320,anon_var_dwarf_15175,anon_var_dwarf_15175 + 4);
  local_1300[0] = local_12f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1300,anon_var_dwarf_15181,anon_var_dwarf_15181 + 4);
  local_12e0[0] = local_12d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12e0,anon_var_dwarf_1518d,anon_var_dwarf_1518d + 4);
  local_12c0[0] = local_12b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12c0,anon_var_dwarf_15199,anon_var_dwarf_15199 + 2);
  local_12a0[0] = local_1290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a0,anon_var_dwarf_151a5,anon_var_dwarf_151a5 + 2);
  local_1280[0] = local_1270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1280,anon_var_dwarf_151b1,anon_var_dwarf_151b1 + 3);
  local_1260[0] = local_1250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1260,anon_var_dwarf_151bd,anon_var_dwarf_151bd + 3);
  local_1240[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1240,anon_var_dwarf_151c9,anon_var_dwarf_151c9 + 4);
  local_1220[0] = local_1210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1220,anon_var_dwarf_151d5,anon_var_dwarf_151d5 + 4);
  local_1200[0] = local_11f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1200,anon_var_dwarf_151e1,anon_var_dwarf_151e1 + 4);
  local_11e0[0] = local_11d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11e0,anon_var_dwarf_151ed,anon_var_dwarf_151ed + 4);
  local_11c0[0] = local_11b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11c0,anon_var_dwarf_151f9,anon_var_dwarf_151f9 + 4);
  local_11a0[0] = local_1190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11a0,anon_var_dwarf_15205,anon_var_dwarf_15205 + 4);
  local_1180[0] = local_1170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1180,anon_var_dwarf_15211,anon_var_dwarf_15211 + 4);
  local_1160[0] = local_1150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1160,anon_var_dwarf_1521d,anon_var_dwarf_1521d + 4);
  local_1140[0] = local_1130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1140,anon_var_dwarf_15229,anon_var_dwarf_15229 + 4);
  local_1120[0] = local_1110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1120,anon_var_dwarf_15235,anon_var_dwarf_15235 + 4);
  local_1100[0] = local_10f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1100,anon_var_dwarf_15241,anon_var_dwarf_15241 + 4);
  local_10e0[0] = local_10d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10e0,anon_var_dwarf_1524d,anon_var_dwarf_1524d + 4);
  local_10c0[0] = local_10b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10c0,anon_var_dwarf_15259,anon_var_dwarf_15259 + 4);
  local_10a0[0] = local_1090;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10a0,anon_var_dwarf_15265,anon_var_dwarf_15265 + 2);
  local_1080[0] = local_1070;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1080,anon_var_dwarf_15271,anon_var_dwarf_15271 + 2);
  local_1060[0] = local_1050;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1060,anon_var_dwarf_1527d,anon_var_dwarf_1527d + 4);
  local_1040[0] = local_1030;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1040,anon_var_dwarf_15289,anon_var_dwarf_15289 + 4);
  local_1020[0] = local_1010;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1020,anon_var_dwarf_15295,anon_var_dwarf_15295 + 4);
  local_1000[0] = local_ff0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1000,anon_var_dwarf_152a1,anon_var_dwarf_152a1 + 4);
  local_fe0[0] = local_fd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fe0,anon_var_dwarf_152ad,anon_var_dwarf_152ad + 4);
  local_fc0[0] = local_fb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fc0,anon_var_dwarf_152b9,anon_var_dwarf_152b9 + 3);
  local_fa0[0] = local_f90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fa0,anon_var_dwarf_152c5,anon_var_dwarf_152c5 + 2);
  local_f80[0] = local_f70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f80,anon_var_dwarf_152d1,anon_var_dwarf_152d1 + 2);
  local_f60[0] = local_f50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f60,anon_var_dwarf_152dd,anon_var_dwarf_152dd + 3);
  local_f40[0] = local_f30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f40,anon_var_dwarf_152e9,anon_var_dwarf_152e9 + 3);
  local_f20[0] = local_f10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f20,anon_var_dwarf_152f5,anon_var_dwarf_152f5 + 3);
  local_f00[0] = local_ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f00,anon_var_dwarf_15301,anon_var_dwarf_15301 + 2);
  local_ee0[0] = local_ed0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ee0,anon_var_dwarf_1530d,anon_var_dwarf_1530d + 2);
  local_ec0[0] = local_eb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ec0,anon_var_dwarf_15319,anon_var_dwarf_15319 + 2);
  local_ea0[0] = local_e90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ea0,anon_var_dwarf_15325,anon_var_dwarf_15325 + 2);
  local_e80[0] = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e80,anon_var_dwarf_15331,anon_var_dwarf_15331 + 2);
  local_e60[0] = local_e50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e60,anon_var_dwarf_15121,anon_var_dwarf_15121 + 2);
  local_e40[0] = local_e30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e40,anon_var_dwarf_1533d,anon_var_dwarf_1533d + 3);
  local_e20[0] = local_e10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e20,anon_var_dwarf_15349,anon_var_dwarf_15349 + 3);
  local_e00[0] = local_df0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e00,anon_var_dwarf_15355,anon_var_dwarf_15355 + 3);
  local_de0[0] = local_dd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_de0,anon_var_dwarf_15361,anon_var_dwarf_15361 + 3);
  local_dc0[0] = local_db0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dc0,anon_var_dwarf_1536d,anon_var_dwarf_1536d + 3);
  local_da0[0] = local_d90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_da0,anon_var_dwarf_151bd,anon_var_dwarf_151bd + 3);
  local_d80[0] = local_d70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,anon_var_dwarf_15379,anon_var_dwarf_15379 + 2);
  local_d60[0] = local_d50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d60,anon_var_dwarf_15385,anon_var_dwarf_15385 + 2);
  local_d40[0] = local_d30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d40,anon_var_dwarf_15391,anon_var_dwarf_15391 + 2);
  local_d20[0] = local_d10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d20,anon_var_dwarf_1539d,anon_var_dwarf_1539d + 2);
  local_d00[0] = local_cf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d00,anon_var_dwarf_153a9,anon_var_dwarf_153a9 + 2);
  local_ce0[0] = local_cd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ce0,anon_var_dwarf_153b5,anon_var_dwarf_153b5 + 2);
  local_cc0[0] = local_cb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc0,anon_var_dwarf_153c1,anon_var_dwarf_153c1 + 2);
  local_ca0[0] = local_c90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ca0,anon_var_dwarf_153cd,anon_var_dwarf_153cd + 2);
  local_c80[0] = local_c70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c80,anon_var_dwarf_153d9,anon_var_dwarf_153d9 + 2);
  local_c60[0] = local_c50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c60,anon_var_dwarf_153e5,anon_var_dwarf_153e5 + 2);
  local_c40[0] = local_c30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c40,anon_var_dwarf_153f1,anon_var_dwarf_153f1 + 2);
  local_c20[0] = local_c10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c20,anon_var_dwarf_153fd,anon_var_dwarf_153fd + 2);
  local_c00[0] = local_bf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c00,anon_var_dwarf_15409,anon_var_dwarf_15409 + 2);
  local_be0[0] = local_bd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_be0,anon_var_dwarf_15415,anon_var_dwarf_15415 + 2);
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,anon_var_dwarf_14fa1,anon_var_dwarf_14fa1 + 2);
  local_ba0[0] = local_b90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ba0,anon_var_dwarf_15421,anon_var_dwarf_15421 + 2);
  local_b80[0] = local_b70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b80,anon_var_dwarf_1542d,anon_var_dwarf_1542d + 2);
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b60,anon_var_dwarf_15439,anon_var_dwarf_15439 + 2);
  local_b40[0] = local_b30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b40,anon_var_dwarf_15445,anon_var_dwarf_15445 + 2);
  local_b20[0] = local_b10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b20,anon_var_dwarf_15451,anon_var_dwarf_15451 + 2);
  plVar4 = local_af0;
  local_b00[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b00,anon_var_dwarf_1545d,anon_var_dwarf_1545d + 2);
  local_ae0[0] = local_ad0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ae0,anon_var_dwarf_14a61,anon_var_dwarf_14a61 + 2);
  local_ac0[0] = local_ab0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ac0,anon_var_dwarf_15469,anon_var_dwarf_15469 + 2);
  local_aa0[0] = local_a90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_aa0,anon_var_dwarf_15475,anon_var_dwarf_15475 + 2);
  local_a80[0] = local_a70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a80,anon_var_dwarf_15481,anon_var_dwarf_15481 + 2);
  local_a60[0] = local_a50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a60,anon_var_dwarf_1548d,anon_var_dwarf_1548d + 3);
  local_a40[0] = local_a30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a40,anon_var_dwarf_15499,anon_var_dwarf_15499 + 3);
  local_a20[0] = local_a10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a20,anon_var_dwarf_14e45,anon_var_dwarf_14e45 + 3);
  local_a00[0] = local_9f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a00,anon_var_dwarf_154a5,anon_var_dwarf_154a5 + 3);
  local_9e0[0] = local_9d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9e0,anon_var_dwarf_154b1,anon_var_dwarf_154b1 + 3);
  local_9c0[0] = local_9b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9c0,anon_var_dwarf_154bd,anon_var_dwarf_154bd + 3);
  local_9a0[0] = local_990;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9a0,anon_var_dwarf_154c9,anon_var_dwarf_154c9 + 3);
  local_980[0] = local_970;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_980,anon_var_dwarf_154d5,anon_var_dwarf_154d5 + 3);
  local_960[0] = local_950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_960,anon_var_dwarf_154e1,anon_var_dwarf_154e1 + 3);
  local_940[0] = local_930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_940,anon_var_dwarf_154ed,anon_var_dwarf_154ed + 3);
  local_920[0] = local_910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_920,anon_var_dwarf_154f9,anon_var_dwarf_154f9 + 3);
  local_900[0] = local_8f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_900,anon_var_dwarf_15505,anon_var_dwarf_15505 + 3);
  local_8e0[0] = local_8d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e0,anon_var_dwarf_15511,anon_var_dwarf_15511 + 2);
  local_8c0[0] = local_8b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c0,anon_var_dwarf_1551d,anon_var_dwarf_1551d + 2);
  local_8a0[0] = local_890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8a0,anon_var_dwarf_15529,anon_var_dwarf_15529 + 2);
  local_880[0] = local_870;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_880,anon_var_dwarf_15535,anon_var_dwarf_15535 + 2);
  local_860[0] = local_850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_860,anon_var_dwarf_15541,anon_var_dwarf_15541 + 2);
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_840,anon_var_dwarf_1554d,anon_var_dwarf_1554d + 2);
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_820,anon_var_dwarf_15559,anon_var_dwarf_15559 + 2);
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_800,anon_var_dwarf_15565,anon_var_dwarf_15565 + 2);
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e0,anon_var_dwarf_14f89,anon_var_dwarf_14f89 + 2);
  local_7c0[0] = local_7b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7c0,anon_var_dwarf_15571,anon_var_dwarf_15571 + 2);
  local_7a0[0] = local_790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a0,anon_var_dwarf_1557d,anon_var_dwarf_1557d + 2);
  local_780[0] = local_770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_780,anon_var_dwarf_15589,anon_var_dwarf_15589 + 2);
  local_760[0] = local_750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_760,anon_var_dwarf_15595,anon_var_dwarf_15595 + 2);
  local_740[0] = local_730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_740,anon_var_dwarf_14fad,anon_var_dwarf_14fad + 2);
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_720,anon_var_dwarf_155a1,anon_var_dwarf_155a1 + 2);
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_700,anon_var_dwarf_155ad,anon_var_dwarf_155ad + 2);
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6e0,anon_var_dwarf_155b9,anon_var_dwarf_155b9 + 2);
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c0,anon_var_dwarf_155c5,anon_var_dwarf_155c5 + 2);
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a0,anon_var_dwarf_155d1,anon_var_dwarf_155d1 + 2);
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_680,anon_var_dwarf_15019,anon_var_dwarf_15019 + 2);
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_660,anon_var_dwarf_155dd,anon_var_dwarf_155dd + 2);
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_640,anon_var_dwarf_155e9,anon_var_dwarf_155e9 + 2);
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_620,anon_var_dwarf_155f5,anon_var_dwarf_155f5 + 2);
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_600,anon_var_dwarf_15601,anon_var_dwarf_15601 + 3);
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e0,anon_var_dwarf_1560d,anon_var_dwarf_1560d + 3);
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c0,anon_var_dwarf_15619,anon_var_dwarf_15619 + 3);
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a0,anon_var_dwarf_15625,anon_var_dwarf_15625 + 3);
  local_580[0] = local_570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_580,anon_var_dwarf_15631,anon_var_dwarf_15631 + 3);
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_560,anon_var_dwarf_1563d,anon_var_dwarf_1563d + 3);
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_540,anon_var_dwarf_15649,anon_var_dwarf_15649 + 3);
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_520,anon_var_dwarf_15655,anon_var_dwarf_15655 + 3);
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,anon_var_dwarf_15661,anon_var_dwarf_15661 + 3);
  local_4e0[0] = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e0,anon_var_dwarf_1566d,anon_var_dwarf_1566d + 3);
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c0,anon_var_dwarf_15679,anon_var_dwarf_15679 + 3);
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a0,anon_var_dwarf_15685,anon_var_dwarf_15685 + 3);
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_480,anon_var_dwarf_15691,anon_var_dwarf_15691 + 3);
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_460,anon_var_dwarf_1569d,anon_var_dwarf_1569d + 3);
  local_440[0] = local_430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_440,anon_var_dwarf_14fc5,anon_var_dwarf_14fc5 + 3);
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_420,anon_var_dwarf_156a9,anon_var_dwarf_156a9 + 3);
  local_400[0] = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_400,anon_var_dwarf_156b5,anon_var_dwarf_156b5 + 3);
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e0,anon_var_dwarf_156c1,anon_var_dwarf_156c1 + 3);
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c0,anon_var_dwarf_156cd,anon_var_dwarf_156cd + 3);
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a0,anon_var_dwarf_156d9,anon_var_dwarf_156d9 + 3);
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,anon_var_dwarf_156e5,anon_var_dwarf_156e5 + 3);
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,anon_var_dwarf_14eb1,anon_var_dwarf_14eb1 + 3);
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,anon_var_dwarf_156f1,anon_var_dwarf_156f1 + 3);
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_320,anon_var_dwarf_156fd,anon_var_dwarf_156fd + 3);
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_300,anon_var_dwarf_15709,anon_var_dwarf_15709 + 3);
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e0,anon_var_dwarf_15715,anon_var_dwarf_15715 + 3);
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c0,anon_var_dwarf_15721,anon_var_dwarf_15721 + 3);
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,anon_var_dwarf_1572d,anon_var_dwarf_1572d + 2);
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_280,anon_var_dwarf_1490b + 4,anon_var_dwarf_1490b + 6);
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_260,anon_var_dwarf_15745,anon_var_dwarf_15745 + 2);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_240,anon_var_dwarf_15751,anon_var_dwarf_15751 + 2);
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,anon_var_dwarf_1575d,anon_var_dwarf_1575d + 2);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,anon_var_dwarf_15769,anon_var_dwarf_15769 + 2);
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,anon_var_dwarf_15775,anon_var_dwarf_15775 + 2);
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,anon_var_dwarf_15781,anon_var_dwarf_15781 + 2);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,anon_var_dwarf_1578d,anon_var_dwarf_1578d + 3);
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,anon_var_dwarf_15799,anon_var_dwarf_15799 + 3);
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,anon_var_dwarf_157a5,anon_var_dwarf_157a5 + 3);
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,anon_var_dwarf_157b1,anon_var_dwarf_157b1 + 3);
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,anon_var_dwarf_157bd,anon_var_dwarf_157bd + 3);
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,anon_var_dwarf_157c9,anon_var_dwarf_157c9 + 3);
  plVar8 = local_d0;
  local_e0[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e0,anon_var_dwarf_15079,anon_var_dwarf_15079 + 3);
  __l_00._M_len = 0xd8;
  __l_00._M_array = (iterator)&local_1bc0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,__l_00,(allocator_type *)local_1c08);
  lVar7 = -0x1b00;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  local_1bc0._M_allocated_capacity = (size_type)&local_1bb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1bc0,"k","");
  local_1ba0 = &local_1b90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ba0,"g","");
  local_1b80 = &local_1b78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b80,"q","");
  local_1b60._M_allocated_capacity = (size_type)local_1b50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b60,"4","");
  local_1b40[0] = local_1b30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b40,"6","");
  local_1b20[0] = local_1b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b20,"9","");
  local_1b00[0] = local_1af0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b00,anon_var_dwarf_1581d,anon_var_dwarf_1581d + 2);
  local_1ae0[0] = local_1ad0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ae0,anon_var_dwarf_15829,anon_var_dwarf_15829 + 3);
  local_1ac0[0] = local_1ab0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ac0,anon_var_dwarf_15835,anon_var_dwarf_15835 + 3);
  local_1aa0[0] = local_1a90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1aa0,anon_var_dwarf_15841,anon_var_dwarf_15841 + 3);
  local_1a80[0] = local_1a70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a80,anon_var_dwarf_1584d,anon_var_dwarf_1584d + 4);
  local_1a60[0] = local_1a50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a60,anon_var_dwarf_15859,anon_var_dwarf_15859 + 4);
  local_1a40[0] = local_1a30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a40,anon_var_dwarf_15865,anon_var_dwarf_15865 + 4);
  local_1a20[0] = local_1a10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a20,anon_var_dwarf_15871,anon_var_dwarf_15871 + 4);
  local_1a00[0] = local_19f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a00,anon_var_dwarf_1587d,anon_var_dwarf_1587d + 4);
  local_19e0[0] = local_19d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19e0,anon_var_dwarf_15889,anon_var_dwarf_15889 + 4);
  local_19c0[0] = local_19b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19c0,anon_var_dwarf_15895,anon_var_dwarf_15895 + 4);
  local_19a0[0] = local_1990;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19a0,anon_var_dwarf_158a1,anon_var_dwarf_158a1 + 4);
  local_1980[0] = local_1970;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1980,anon_var_dwarf_158ad,anon_var_dwarf_158ad + 4);
  local_1960[0] = local_1950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1960,anon_var_dwarf_158b9,anon_var_dwarf_158b9 + 4);
  local_1940[0] = local_1930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1940,anon_var_dwarf_158c5,anon_var_dwarf_158c5 + 4);
  local_1920[0] = local_1910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1920,anon_var_dwarf_158d1,anon_var_dwarf_158d1 + 4);
  local_1900[0] = local_18f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1900,anon_var_dwarf_158dd,anon_var_dwarf_158dd + 2);
  local_18e0[0] = local_18d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18e0,anon_var_dwarf_158e9,anon_var_dwarf_158e9 + 3);
  local_18c0[0] = local_18b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18c0,anon_var_dwarf_158f5,anon_var_dwarf_158f5 + 2);
  local_18a0[0] = local_1890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18a0,anon_var_dwarf_15901,anon_var_dwarf_15901 + 2);
  local_1880[0] = local_1870;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1880,anon_var_dwarf_1590d,anon_var_dwarf_1590d + 4);
  local_1860[0] = local_1850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1860,anon_var_dwarf_15919,anon_var_dwarf_15919 + 4);
  local_1840[0] = local_1830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1840,anon_var_dwarf_15925,anon_var_dwarf_15925 + 4);
  local_1820[0] = local_1810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1820,anon_var_dwarf_15931,anon_var_dwarf_15931 + 4);
  local_1800[0] = local_17f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1800,anon_var_dwarf_1593d,anon_var_dwarf_1593d + 4);
  local_17e0[0] = local_17d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17e0,anon_var_dwarf_15949,anon_var_dwarf_15949 + 4);
  local_17c0[0] = local_17b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17c0,anon_var_dwarf_15955,anon_var_dwarf_15955 + 4);
  local_17a0[0] = local_1790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17a0,anon_var_dwarf_15961,anon_var_dwarf_15961 + 4);
  local_1780[0] = local_1770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1780,anon_var_dwarf_1596d,anon_var_dwarf_1596d + 4);
  local_1760[0] = local_1750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1760,anon_var_dwarf_15979,anon_var_dwarf_15979 + 4);
  local_1740[0] = local_1730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1740,anon_var_dwarf_15985,anon_var_dwarf_15985 + 3);
  local_1720[0] = local_1710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1720,anon_var_dwarf_15991,anon_var_dwarf_15991 + 4);
  local_1700[0] = local_16f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1700,anon_var_dwarf_1599d,anon_var_dwarf_1599d + 4);
  local_16e0[0] = local_16d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e0,anon_var_dwarf_159a9,anon_var_dwarf_159a9 + 4);
  local_16c0[0] = local_16b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16c0,anon_var_dwarf_159b5,anon_var_dwarf_159b5 + 2);
  local_16a0[0] = local_1690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16a0,anon_var_dwarf_159c1,anon_var_dwarf_159c1 + 3);
  local_1680[0] = local_1670;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1680,anon_var_dwarf_159cd,anon_var_dwarf_159cd + 3);
  local_1660[0] = local_1650;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1660,anon_var_dwarf_159d9,anon_var_dwarf_159d9 + 3);
  local_1640[0] = local_1630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1640,anon_var_dwarf_159e5,anon_var_dwarf_159e5 + 2);
  local_1620[0] = local_1610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1620,anon_var_dwarf_159f1,anon_var_dwarf_159f1 + 2);
  local_1600[0] = local_15f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1600,anon_var_dwarf_159fd,anon_var_dwarf_159fd + 2);
  local_15e0[0] = local_15d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15e0,anon_var_dwarf_15a09,anon_var_dwarf_15a09 + 2);
  local_15c0[0] = local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,anon_var_dwarf_15a15,anon_var_dwarf_15a15 + 2);
  local_15a0[0] = local_1590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15a0,anon_var_dwarf_15a21,anon_var_dwarf_15a21 + 2);
  local_1580[0] = local_1570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1580,anon_var_dwarf_15a2d,anon_var_dwarf_15a2d + 2);
  local_1560[0] = local_1550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1560,anon_var_dwarf_15a39,anon_var_dwarf_15a39 + 2);
  local_1540[0] = local_1530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1540,anon_var_dwarf_15a45,anon_var_dwarf_15a45 + 2);
  local_1520[0] = local_1510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1520,anon_var_dwarf_15a51,anon_var_dwarf_15a51 + 2);
  local_1500[0] = local_14f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1500,anon_var_dwarf_15a5d,anon_var_dwarf_15a5d + 2);
  local_14e0[0] = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14e0,anon_var_dwarf_15a69,anon_var_dwarf_15a69 + 3);
  local_14c0[0] = local_14b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14c0,anon_var_dwarf_15a75,anon_var_dwarf_15a75 + 3);
  local_14a0[0] = local_1490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a0,anon_var_dwarf_15a81,anon_var_dwarf_15a81 + 3);
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1480,anon_var_dwarf_15a8d,anon_var_dwarf_15a8d + 2);
  local_1460[0] = local_1450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1460,anon_var_dwarf_1581d,anon_var_dwarf_1581d + 2);
  local_1440[0] = local_1430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1440,anon_var_dwarf_15a99,anon_var_dwarf_15a99 + 2);
  local_1420[0] = local_1410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1420,anon_var_dwarf_15aa5,anon_var_dwarf_15aa5 + 2);
  local_1400[0] = local_13f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1400,anon_var_dwarf_15ab1,anon_var_dwarf_15ab1 + 2);
  local_13e0[0] = local_13d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e0,anon_var_dwarf_15abd,anon_var_dwarf_15abd + 2);
  local_13c0[0] = local_13b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13c0,anon_var_dwarf_15ac9,anon_var_dwarf_15ac9 + 2);
  local_13a0[0] = local_1390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a0,anon_var_dwarf_15ad5,anon_var_dwarf_15ad5 + 2);
  local_1380[0] = local_1370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1380,anon_var_dwarf_158dd,anon_var_dwarf_158dd + 2);
  local_1360[0] = local_1350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1360,anon_var_dwarf_15ae1,anon_var_dwarf_15ae1 + 2);
  local_1340[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1340,"@","");
  __l_01._M_len = 0x45;
  __l_01._M_array = (iterator)&local_1bc0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,__l_01,(allocator_type *)local_1c08);
  lVar7 = -0x8a0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  local_1bc0._M_allocated_capacity = (size_type)&local_1bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1bc0,anon_var_dwarf_15af9,anon_var_dwarf_15af9 + 3);
  local_1ba0 = &local_1b90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1ba0,anon_var_dwarf_15b05,anon_var_dwarf_15b05 + 2);
  local_1b80 = &local_1b78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b80,anon_var_dwarf_15b11,anon_var_dwarf_15b11 + 2);
  local_1b60._M_allocated_capacity = (size_type)local_1b50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b60,"e","");
  local_1b40[0] = local_1b30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b40,"3","");
  local_1b20[0] = local_1b10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b20,"u","");
  local_1b00[0] = local_1af0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b00,anon_var_dwarf_15b41,anon_var_dwarf_15b41 + 3);
  local_1ae0[0] = local_1ad0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ae0,anon_var_dwarf_15b4d,anon_var_dwarf_15b4d + 3);
  local_1ac0[0] = local_1ab0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ac0,anon_var_dwarf_15b59,anon_var_dwarf_15b59 + 3);
  local_1aa0[0] = local_1a90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1aa0,anon_var_dwarf_15b65,anon_var_dwarf_15b65 + 3);
  local_1a80[0] = local_1a70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a80,anon_var_dwarf_15b71,anon_var_dwarf_15b71 + 4);
  local_1a60[0] = local_1a50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a60,anon_var_dwarf_15b7d,anon_var_dwarf_15b7d + 4);
  local_1a40[0] = local_1a30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a40,anon_var_dwarf_15b89,anon_var_dwarf_15b89 + 4);
  local_1a20[0] = local_1a10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a20,anon_var_dwarf_15b95,anon_var_dwarf_15b95 + 4);
  local_1a00[0] = local_19f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a00,anon_var_dwarf_15ba1,anon_var_dwarf_15ba1 + 4);
  local_19e0[0] = local_19d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19e0,anon_var_dwarf_15bad,anon_var_dwarf_15bad + 4);
  local_19c0[0] = local_19b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19c0,anon_var_dwarf_15bb9,anon_var_dwarf_15bb9 + 4);
  local_19a0[0] = local_1990;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19a0,anon_var_dwarf_15bc5,anon_var_dwarf_15bc5 + 4);
  local_1980[0] = local_1970;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1980,anon_var_dwarf_15bd1,anon_var_dwarf_15bd1 + 4);
  local_1960[0] = local_1950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1960,anon_var_dwarf_15bdd,anon_var_dwarf_15bdd + 4);
  local_1940[0] = local_1930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1940,anon_var_dwarf_15be9,anon_var_dwarf_15be9 + 4);
  local_1920[0] = local_1910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1920,anon_var_dwarf_15bf5,anon_var_dwarf_15bf5 + 4);
  local_1900[0] = local_18f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1900,anon_var_dwarf_15c01,anon_var_dwarf_15c01 + 3);
  local_18e0[0] = local_18d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18e0,anon_var_dwarf_15c0d,anon_var_dwarf_15c0d + 2);
  local_18c0[0] = local_18b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18c0,anon_var_dwarf_15c19,anon_var_dwarf_15c19 + 2);
  local_18a0[0] = local_1890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18a0,anon_var_dwarf_15c25,anon_var_dwarf_15c25 + 3);
  local_1880[0] = local_1870;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1880,anon_var_dwarf_15c31,anon_var_dwarf_15c31 + 3);
  local_1860[0] = local_1850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1860,anon_var_dwarf_15c3d,anon_var_dwarf_15c3d + 3);
  local_1840[0] = local_1830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1840,anon_var_dwarf_15c49,anon_var_dwarf_15c49 + 4);
  local_1820[0] = local_1810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1820,anon_var_dwarf_15c55,anon_var_dwarf_15c55 + 4);
  local_1800[0] = local_17f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1800,anon_var_dwarf_15c61,anon_var_dwarf_15c61 + 4);
  local_17e0[0] = local_17d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17e0,anon_var_dwarf_15c6d,anon_var_dwarf_15c6d + 4);
  local_17c0[0] = local_17b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17c0,anon_var_dwarf_15c79,anon_var_dwarf_15c79 + 4);
  local_17a0[0] = local_1790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17a0,anon_var_dwarf_15c85,anon_var_dwarf_15c85 + 4);
  local_1780[0] = local_1770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1780,anon_var_dwarf_15c91,anon_var_dwarf_15c91 + 4);
  local_1760[0] = local_1750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1760,anon_var_dwarf_15c9d,anon_var_dwarf_15c9d + 4);
  local_1740[0] = local_1730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1740,anon_var_dwarf_15ca9,anon_var_dwarf_15ca9 + 4);
  local_1720[0] = local_1710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1720,anon_var_dwarf_15cb5,anon_var_dwarf_15cb5 + 4);
  local_1700[0] = local_16f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1700,anon_var_dwarf_15cc1,anon_var_dwarf_15cc1 + 4);
  local_16e0[0] = local_16d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e0,anon_var_dwarf_15ccd,anon_var_dwarf_15ccd + 4);
  local_16c0[0] = local_16b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16c0,anon_var_dwarf_15cd9,anon_var_dwarf_15cd9 + 2);
  local_16a0[0] = local_1690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16a0,anon_var_dwarf_15ce5,anon_var_dwarf_15ce5 + 4);
  local_1680[0] = local_1670;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1680,anon_var_dwarf_15cf1,anon_var_dwarf_15cf1 + 4);
  local_1660[0] = local_1650;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1660,anon_var_dwarf_15cfd,anon_var_dwarf_15cfd + 4);
  local_1640[0] = local_1630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1640,anon_var_dwarf_15d09,anon_var_dwarf_15d09 + 4);
  local_1620[0] = local_1610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1620,anon_var_dwarf_15d15,anon_var_dwarf_15d15 + 4);
  local_1600[0] = local_15f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1600,anon_var_dwarf_15d21,anon_var_dwarf_15d21 + 2);
  local_15e0[0] = local_15d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15e0,anon_var_dwarf_15d2d,anon_var_dwarf_15d2d + 3);
  local_15c0[0] = local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,anon_var_dwarf_15d39,anon_var_dwarf_15d39 + 3);
  local_15a0[0] = local_1590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15a0,anon_var_dwarf_15d45,anon_var_dwarf_15d45 + 3);
  local_1580[0] = local_1570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1580,anon_var_dwarf_15d51,anon_var_dwarf_15d51 + 2);
  local_1560[0] = local_1550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1560,anon_var_dwarf_15d5d,anon_var_dwarf_15d5d + 2);
  local_1540[0] = local_1530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1540,anon_var_dwarf_15d69,anon_var_dwarf_15d69 + 2);
  local_1520[0] = local_1510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1520,anon_var_dwarf_15d75,anon_var_dwarf_15d75 + 2);
  local_1500[0] = local_14f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1500,anon_var_dwarf_15d81,anon_var_dwarf_15d81 + 2);
  local_14e0[0] = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14e0,anon_var_dwarf_15d8d,anon_var_dwarf_15d8d + 2);
  local_14c0[0] = local_14b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14c0,anon_var_dwarf_15d99,anon_var_dwarf_15d99 + 2);
  local_14a0[0] = local_1490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a0,anon_var_dwarf_15da5,anon_var_dwarf_15da5 + 2);
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1480,anon_var_dwarf_15db1,anon_var_dwarf_15db1 + 2);
  local_1460[0] = local_1450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1460,anon_var_dwarf_15dbd,anon_var_dwarf_15dbd + 2);
  local_1440[0] = local_1430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1440,anon_var_dwarf_15dc9,anon_var_dwarf_15dc9 + 2);
  local_1420[0] = local_1410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1420,anon_var_dwarf_15dd5,anon_var_dwarf_15dd5 + 2);
  local_1400[0] = local_13f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1400,anon_var_dwarf_15de1,anon_var_dwarf_15de1 + 2);
  local_13e0[0] = local_13d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e0,anon_var_dwarf_15ded,anon_var_dwarf_15ded + 2);
  local_13c0[0] = local_13b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13c0,anon_var_dwarf_15df9,anon_var_dwarf_15df9 + 2);
  local_13a0[0] = local_1390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a0,anon_var_dwarf_15e05,anon_var_dwarf_15e05 + 2);
  local_1380[0] = local_1370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1380,anon_var_dwarf_15e11,anon_var_dwarf_15e11 + 2);
  local_1360[0] = local_1350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1360,anon_var_dwarf_15e1d,anon_var_dwarf_15e1d + 2);
  local_1340[0] = local_1330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1340,anon_var_dwarf_15e29,anon_var_dwarf_15e29 + 3);
  local_1320[0] = local_1310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1320,anon_var_dwarf_15e35,anon_var_dwarf_15e35 + 3);
  local_1300[0] = local_12f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1300,anon_var_dwarf_15e41,anon_var_dwarf_15e41 + 3);
  local_12e0[0] = local_12d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12e0,anon_var_dwarf_15e4d,anon_var_dwarf_15e4d + 3);
  local_12c0[0] = local_12b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12c0,anon_var_dwarf_15e59,anon_var_dwarf_15e59 + 3);
  local_12a0[0] = local_1290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a0,anon_var_dwarf_15e65,anon_var_dwarf_15e65 + 3);
  local_1280[0] = local_1270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1280,anon_var_dwarf_15e71,anon_var_dwarf_15e71 + 3);
  local_1260[0] = local_1250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1260,anon_var_dwarf_15e7d,anon_var_dwarf_15e7d + 3);
  local_1240[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1240,anon_var_dwarf_15e89,anon_var_dwarf_15e89 + 3);
  local_1220[0] = local_1210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1220,anon_var_dwarf_15af9,anon_var_dwarf_15af9 + 3);
  local_1200[0] = local_11f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1200,anon_var_dwarf_15e95,anon_var_dwarf_15e95 + 3);
  local_11e0[0] = local_11d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11e0,anon_var_dwarf_15ea1,anon_var_dwarf_15ea1 + 3);
  local_11c0[0] = local_11b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11c0,anon_var_dwarf_15ead,anon_var_dwarf_15ead + 3);
  local_11a0[0] = local_1190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11a0,anon_var_dwarf_15eb9,anon_var_dwarf_15eb9 + 3);
  local_1180[0] = local_1170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1180,anon_var_dwarf_15ec5,anon_var_dwarf_15ec5 + 3);
  local_1160[0] = local_1150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1160,anon_var_dwarf_15ed1,anon_var_dwarf_15ed1 + 3);
  local_1140[0] = local_1130;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1140,anon_var_dwarf_15edd,anon_var_dwarf_15edd + 3);
  local_1120[0] = local_1110;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1120,anon_var_dwarf_15ee9,anon_var_dwarf_15ee9 + 3);
  local_1100[0] = local_10f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1100,anon_var_dwarf_15ef5,anon_var_dwarf_15ef5 + 3);
  local_10e0[0] = local_10d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10e0,anon_var_dwarf_15f01,anon_var_dwarf_15f01 + 3);
  local_10c0[0] = local_10b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10c0,anon_var_dwarf_15f0d,anon_var_dwarf_15f0d + 3);
  local_10a0[0] = local_1090;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10a0,anon_var_dwarf_15f19,anon_var_dwarf_15f19 + 2);
  local_1080[0] = local_1070;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1080,anon_var_dwarf_15f25,anon_var_dwarf_15f25 + 2);
  local_1060[0] = local_1050;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1060,anon_var_dwarf_15f31,anon_var_dwarf_15f31 + 2);
  local_1040[0] = local_1030;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1040,anon_var_dwarf_15f3d,anon_var_dwarf_15f3d + 2);
  local_1020[0] = local_1010;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1020,anon_var_dwarf_15f49,anon_var_dwarf_15f49 + 2);
  local_1000[0] = local_ff0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1000,anon_var_dwarf_15f55,anon_var_dwarf_15f55 + 2);
  local_fe0[0] = local_fd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fe0,anon_var_dwarf_15f61,anon_var_dwarf_15f61 + 2);
  local_fc0[0] = local_fb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fc0,anon_var_dwarf_15f6d,anon_var_dwarf_15f6d + 2);
  local_fa0[0] = local_f90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fa0,anon_var_dwarf_15f79,anon_var_dwarf_15f79 + 2);
  local_f80[0] = local_f70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f80,anon_var_dwarf_15f85,anon_var_dwarf_15f85 + 2);
  local_f60[0] = local_f50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f60,anon_var_dwarf_15f91,anon_var_dwarf_15f91 + 2);
  local_f40[0] = local_f30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f40,anon_var_dwarf_15f9d,anon_var_dwarf_15f9d + 2);
  local_f20[0] = local_f10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f20,anon_var_dwarf_15fa9,anon_var_dwarf_15fa9 + 2);
  local_f00[0] = local_ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f00,anon_var_dwarf_15fb5,anon_var_dwarf_15fb5 + 2);
  local_ee0[0] = local_ed0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ee0,anon_var_dwarf_15fc1,anon_var_dwarf_15fc1 + 2);
  local_ec0[0] = local_eb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ec0,anon_var_dwarf_15fcd,anon_var_dwarf_15fcd + 2);
  local_ea0[0] = local_e90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ea0,anon_var_dwarf_15fd9,anon_var_dwarf_15fd9 + 2);
  local_e80[0] = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e80,anon_var_dwarf_15fe5,anon_var_dwarf_15fe5 + 2);
  local_e60[0] = local_e50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e60,anon_var_dwarf_15ff1,anon_var_dwarf_15ff1 + 2);
  local_e40[0] = local_e30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e40,anon_var_dwarf_15ffd,anon_var_dwarf_15ffd + 2);
  local_e20[0] = local_e10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e20,anon_var_dwarf_16009,anon_var_dwarf_16009 + 2);
  local_e00[0] = local_df0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e00,anon_var_dwarf_16015,anon_var_dwarf_16015 + 2);
  local_de0[0] = local_dd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_de0,anon_var_dwarf_15c0d,anon_var_dwarf_15c0d + 2);
  local_dc0[0] = local_db0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dc0,anon_var_dwarf_16021,anon_var_dwarf_16021 + 2);
  local_da0[0] = local_d90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_da0,anon_var_dwarf_1602d,anon_var_dwarf_1602d + 2);
  local_d80[0] = local_d70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,anon_var_dwarf_16039,anon_var_dwarf_16039 + 3);
  local_d60[0] = local_d50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d60,anon_var_dwarf_16045,anon_var_dwarf_16045 + 3);
  local_d40[0] = local_d30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d40,anon_var_dwarf_16051,anon_var_dwarf_16051 + 3);
  local_d20[0] = local_d10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d20,anon_var_dwarf_1605d,anon_var_dwarf_1605d + 3);
  local_d00[0] = local_cf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d00,anon_var_dwarf_16069,anon_var_dwarf_16069 + 3);
  local_ce0[0] = local_cd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ce0,anon_var_dwarf_16075,anon_var_dwarf_16075 + 3);
  local_cc0[0] = local_cb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc0,anon_var_dwarf_16081,anon_var_dwarf_16081 + 3);
  local_ca0[0] = local_c90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ca0,anon_var_dwarf_1608d,anon_var_dwarf_1608d + 3);
  local_c80[0] = local_c70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c80,anon_var_dwarf_16099,anon_var_dwarf_16099 + 3);
  local_c60[0] = local_c50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c60,anon_var_dwarf_160a5,anon_var_dwarf_160a5 + 3);
  local_c40[0] = local_c30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c40,anon_var_dwarf_160b1,anon_var_dwarf_160b1 + 3);
  local_c20[0] = local_c10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c20,anon_var_dwarf_160bd,anon_var_dwarf_160bd + 3);
  local_c00[0] = local_bf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c00,anon_var_dwarf_160c9,anon_var_dwarf_160c9 + 3);
  local_be0[0] = local_bd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_be0,anon_var_dwarf_160d5,anon_var_dwarf_160d5 + 3);
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,anon_var_dwarf_160e1,anon_var_dwarf_160e1 + 3);
  local_ba0[0] = local_b90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ba0,anon_var_dwarf_160ed,anon_var_dwarf_160ed + 3);
  local_b80[0] = local_b70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b80,anon_var_dwarf_160f9,anon_var_dwarf_160f9 + 3);
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b60,anon_var_dwarf_16105,anon_var_dwarf_16105 + 3);
  local_b40[0] = local_b30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b40,anon_var_dwarf_16111,anon_var_dwarf_16111 + 3);
  local_b20[0] = local_b10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b20,anon_var_dwarf_1611d,anon_var_dwarf_1611d + 3);
  local_b00[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b00,anon_var_dwarf_16129,anon_var_dwarf_16129 + 3);
  __l_02._M_len = 0x87;
  __l_02._M_array = (iterator)&local_1bc0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,__l_02,(allocator_type *)local_1c08);
  lVar7 = -0x10e0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  local_1bc0._M_allocated_capacity = (size_type)&local_1bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1bc0,anon_var_dwarf_164dd + 0x77,anon_var_dwarf_164dd + 0x79);
  local_1ba0 = &local_1b90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1ba0,anon_var_dwarf_16141,anon_var_dwarf_16141 + 2);
  local_1b80 = &local_1b78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b80,"r","");
  local_1b60._M_allocated_capacity = (size_type)local_1b50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b60,anon_var_dwarf_16159,anon_var_dwarf_16159 + 4);
  local_1b40[0] = local_1b30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b40,anon_var_dwarf_16165,anon_var_dwarf_16165 + 4);
  local_1b20[0] = local_1b10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b20,anon_var_dwarf_16171,anon_var_dwarf_16171 + 4);
  local_1b00[0] = local_1af0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b00,anon_var_dwarf_1617d,anon_var_dwarf_1617d + 4);
  local_1ae0[0] = local_1ad0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ae0,anon_var_dwarf_16189,anon_var_dwarf_16189 + 4);
  local_1ac0[0] = local_1ab0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ac0,anon_var_dwarf_16195,anon_var_dwarf_16195 + 4);
  local_1aa0[0] = local_1a90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1aa0,anon_var_dwarf_161a1,anon_var_dwarf_161a1 + 4);
  local_1a80[0] = local_1a70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a80,anon_var_dwarf_161ad,anon_var_dwarf_161ad + 4);
  local_1a60[0] = local_1a50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a60,anon_var_dwarf_161b9,anon_var_dwarf_161b9 + 4);
  local_1a40[0] = local_1a30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a40,anon_var_dwarf_161c5,anon_var_dwarf_161c5 + 4);
  local_1a20[0] = local_1a10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a20,anon_var_dwarf_161d1,anon_var_dwarf_161d1 + 4);
  local_1a00[0] = local_19f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a00,anon_var_dwarf_161dd,anon_var_dwarf_161dd + 4);
  local_19e0[0] = local_19d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19e0,anon_var_dwarf_161e9,anon_var_dwarf_161e9 + 4);
  local_19c0[0] = local_19b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19c0,anon_var_dwarf_161f5,anon_var_dwarf_161f5 + 3);
  local_19a0[0] = local_1990;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19a0,anon_var_dwarf_16201,anon_var_dwarf_16201 + 3);
  local_1980[0] = local_1970;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1980,anon_var_dwarf_1620d,anon_var_dwarf_1620d + 3);
  local_1960[0] = local_1950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1960,anon_var_dwarf_16219,anon_var_dwarf_16219 + 3);
  local_1940[0] = local_1930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1940,anon_var_dwarf_16f05 + 4,anon_var_dwarf_16f05 + 6);
  local_1920[0] = local_1910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1920,anon_var_dwarf_16231,anon_var_dwarf_16231 + 3);
  local_1900[0] = local_18f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1900,anon_var_dwarf_1623d,anon_var_dwarf_1623d + 3);
  local_18e0[0] = local_18d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18e0,anon_var_dwarf_16249,anon_var_dwarf_16249 + 3);
  local_18c0[0] = local_18b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18c0,anon_var_dwarf_16255,anon_var_dwarf_16255 + 3);
  local_18a0[0] = local_1890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18a0,anon_var_dwarf_16261,anon_var_dwarf_16261 + 4);
  local_1880[0] = local_1870;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1880,anon_var_dwarf_1626d,anon_var_dwarf_1626d + 4);
  local_1860[0] = local_1850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1860,anon_var_dwarf_16279,anon_var_dwarf_16279 + 4);
  local_1840[0] = local_1830;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1840,anon_var_dwarf_16285,anon_var_dwarf_16285 + 4);
  local_1820[0] = local_1810;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1820,anon_var_dwarf_16291,anon_var_dwarf_16291 + 4);
  local_1800[0] = local_17f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1800,anon_var_dwarf_1629d,anon_var_dwarf_1629d + 4);
  local_17e0[0] = local_17d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17e0,anon_var_dwarf_162a9,anon_var_dwarf_162a9 + 4);
  local_17c0[0] = local_17b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17c0,anon_var_dwarf_162b5,anon_var_dwarf_162b5 + 4);
  local_17a0[0] = local_1790;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17a0,anon_var_dwarf_162c1,anon_var_dwarf_162c1 + 4);
  local_1780[0] = local_1770;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1780,anon_var_dwarf_162cd,anon_var_dwarf_162cd + 4);
  local_1760[0] = local_1750;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1760,anon_var_dwarf_162d9,anon_var_dwarf_162d9 + 2);
  local_1740[0] = local_1730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1740,anon_var_dwarf_162e5,anon_var_dwarf_162e5 + 3);
  local_1720[0] = local_1710;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1720,anon_var_dwarf_162f1,anon_var_dwarf_162f1 + 3);
  local_1700[0] = local_16f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1700,anon_var_dwarf_162fd,anon_var_dwarf_162fd + 4);
  local_16e0[0] = local_16d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e0,anon_var_dwarf_16309,anon_var_dwarf_16309 + 3);
  local_16c0[0] = local_16b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16c0,anon_var_dwarf_16315,anon_var_dwarf_16315 + 3);
  local_16a0[0] = local_1690;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16a0,anon_var_dwarf_16321,anon_var_dwarf_16321 + 2);
  local_1680[0] = local_1670;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1680,anon_var_dwarf_1632d,anon_var_dwarf_1632d + 2);
  local_1660[0] = local_1650;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1660,anon_var_dwarf_16339,anon_var_dwarf_16339 + 2);
  local_1640[0] = local_1630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1640,anon_var_dwarf_16345,anon_var_dwarf_16345 + 2);
  local_1620[0] = local_1610;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1620,anon_var_dwarf_16351,anon_var_dwarf_16351 + 2);
  local_1600[0] = local_15f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1600,anon_var_dwarf_1635d,anon_var_dwarf_1635d + 2);
  local_15e0[0] = local_15d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15e0,anon_var_dwarf_16369,anon_var_dwarf_16369 + 2);
  local_15c0[0] = local_15b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c0,anon_var_dwarf_16375,anon_var_dwarf_16375 + 2);
  local_15a0[0] = local_1590;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15a0,anon_var_dwarf_16381,anon_var_dwarf_16381 + 3);
  local_1580[0] = local_1570;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1580,anon_var_dwarf_1638d,anon_var_dwarf_1638d + 3);
  local_1560[0] = local_1550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1560,anon_var_dwarf_16399,anon_var_dwarf_16399 + 3);
  local_1540[0] = local_1530;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1540,anon_var_dwarf_163a5,anon_var_dwarf_163a5 + 3);
  local_1520[0] = local_1510;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1520,anon_var_dwarf_163b1,anon_var_dwarf_163b1 + 3);
  local_1500[0] = local_14f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1500,anon_var_dwarf_163bd,anon_var_dwarf_163bd + 3);
  local_14e0[0] = local_14d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14e0,anon_var_dwarf_162e5,anon_var_dwarf_162e5 + 3);
  local_14c0[0] = local_14b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14c0,anon_var_dwarf_163c9,anon_var_dwarf_163c9 + 2);
  local_14a0[0] = local_1490;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a0,anon_var_dwarf_163d5,anon_var_dwarf_163d5 + 2);
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1480,anon_var_dwarf_163e1,anon_var_dwarf_163e1 + 2);
  local_1460[0] = local_1450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1460,anon_var_dwarf_163ed,anon_var_dwarf_163ed + 2);
  local_1440[0] = local_1430;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1440,anon_var_dwarf_163f9,anon_var_dwarf_163f9 + 2);
  local_1420[0] = local_1410;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1420,anon_var_dwarf_16405,anon_var_dwarf_16405 + 2);
  local_1400[0] = local_13f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1400,anon_var_dwarf_16411,anon_var_dwarf_16411 + 2);
  local_13e0[0] = local_13d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e0,anon_var_dwarf_1641d,anon_var_dwarf_1641d + 2);
  local_13c0[0] = local_13b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13c0,anon_var_dwarf_16429,anon_var_dwarf_16429 + 2);
  local_13a0[0] = local_1390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a0,anon_var_dwarf_16435,anon_var_dwarf_16435 + 2);
  local_1380[0] = local_1370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1380,anon_var_dwarf_16441,anon_var_dwarf_16441 + 2);
  local_1360[0] = local_1350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1360,anon_var_dwarf_1644d,anon_var_dwarf_1644d + 3);
  local_1340[0] = local_1330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1340,anon_var_dwarf_16459,anon_var_dwarf_16459 + 3);
  local_1320[0] = local_1310;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1320,anon_var_dwarf_16465,anon_var_dwarf_16465 + 3);
  local_1300[0] = local_12f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1300,anon_var_dwarf_16471,anon_var_dwarf_16471 + 3);
  local_12e0[0] = local_12d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12e0,anon_var_dwarf_1647d,anon_var_dwarf_1647d + 3);
  local_12c0[0] = local_12b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12c0,anon_var_dwarf_16489,anon_var_dwarf_16489 + 3);
  local_12a0[0] = local_1290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a0,anon_var_dwarf_16495,anon_var_dwarf_16495 + 3);
  local_1280[0] = local_1270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1280,anon_var_dwarf_164a1,anon_var_dwarf_164a1 + 3);
  local_1260[0] = local_1250;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1260,anon_var_dwarf_164ad,anon_var_dwarf_164ad + 3);
  local_1240[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1240,anon_var_dwarf_164b9,anon_var_dwarf_164b9 + 3);
  __l_03._M_len = 0x4d;
  __l_03._M_array = (iterator)&local_1bc0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,__l_03,(allocator_type *)local_1c08);
  lVar7 = -0x9a0;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1bc0,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1ba8,&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1b90,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b78,&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1b60,&local_a8);
  __l_04._M_len = 5;
  __l_04._M_array = (iterator)&local_1bc0;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_c0,__l_04,(allocator_type *)local_1c08);
  lVar7 = 0x60;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_1bc0 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  uVar9 = 0;
  do {
    pbVar1 = local_c0.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar9].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = local_c0.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar9].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      local_1be0 = local_1bd0;
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1be0,pcVar2,pcVar2 + pbVar5->_M_string_length);
      switch(uVar9 & 0xffffffff) {
      case 0:
        local_1c08 = (undefined1  [8])0x1580da;
        local_1c00 = &local_1bf0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c00,local_1be0,(long)local_1be0 + local_1bd8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1bc0._M_local_buf,(char *)local_1c08,&local_1c11);
        if (local_1c00 == &local_1bf0) {
          local_1b90._8_8_ = local_1bf0._8_8_;
          local_1ba0 = &local_1b90;
        }
        else {
          local_1ba0 = local_1c00;
        }
        local_1b90._M_allocated_capacity._1_7_ = local_1bf0._M_allocated_capacity._1_7_;
        local_1b90._M_local_buf[0] = local_1bf0._M_local_buf[0];
        local_1b98 = local_1bf8;
        local_1bf8 = (pointer)0x0;
        local_1bf0._M_local_buf[0] = '\0';
        local_1c00 = &local_1bf0;
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c10,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1bc0);
        break;
      case 1:
        local_1c08 = (undefined1  [8])0x157542;
        local_1c00 = &local_1bf0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c00,local_1be0,(long)local_1be0 + local_1bd8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1bc0._M_local_buf,(char *)local_1c08,&local_1c11);
        if (local_1c00 == &local_1bf0) {
          local_1b90._8_8_ = local_1bf0._8_8_;
          local_1ba0 = &local_1b90;
        }
        else {
          local_1ba0 = local_1c00;
        }
        local_1b90._M_allocated_capacity._1_7_ = local_1bf0._M_allocated_capacity._1_7_;
        local_1b90._M_local_buf[0] = local_1bf0._M_local_buf[0];
        local_1b98 = local_1bf8;
        local_1bf8 = (pointer)0x0;
        local_1bf0._M_local_buf[0] = '\0';
        local_1c00 = &local_1bf0;
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c10,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1bc0);
        break;
      case 2:
        local_1c08 = (undefined1  [8])0x158378;
        local_1c00 = &local_1bf0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c00,local_1be0,(long)local_1be0 + local_1bd8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1bc0._M_local_buf,(char *)local_1c08,&local_1c11);
        if (local_1c00 == &local_1bf0) {
          local_1b90._8_8_ = local_1bf0._8_8_;
          local_1ba0 = &local_1b90;
        }
        else {
          local_1ba0 = local_1c00;
        }
        local_1b90._M_allocated_capacity._1_7_ = local_1bf0._M_allocated_capacity._1_7_;
        local_1b90._M_local_buf[0] = local_1bf0._M_local_buf[0];
        local_1b98 = local_1bf8;
        local_1bf8 = (pointer)0x0;
        local_1bf0._M_local_buf[0] = '\0';
        local_1c00 = &local_1bf0;
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c10,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1bc0);
        break;
      case 3:
        local_1c08 = (undefined1  [8])0x158533;
        local_1c00 = &local_1bf0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c00,local_1be0,(long)local_1be0 + local_1bd8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1bc0._M_local_buf,(char *)local_1c08,&local_1c11);
        if (local_1c00 == &local_1bf0) {
          local_1b90._8_8_ = local_1bf0._8_8_;
          local_1ba0 = &local_1b90;
        }
        else {
          local_1ba0 = local_1c00;
        }
        local_1b90._M_allocated_capacity._1_7_ = local_1bf0._M_allocated_capacity._1_7_;
        local_1b90._M_local_buf[0] = local_1bf0._M_local_buf[0];
        local_1b98 = local_1bf8;
        local_1bf8 = (pointer)0x0;
        local_1bf0._M_local_buf[0] = '\0';
        local_1c00 = &local_1bf0;
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c10,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1bc0);
        break;
      case 4:
        local_1c08 = (undefined1  [8])0x1579c5;
        local_1c00 = &local_1bf0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c00,local_1be0,(long)local_1be0 + local_1bd8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1bc0._M_local_buf,(char *)local_1c08,&local_1c11);
        if (local_1c00 == &local_1bf0) {
          local_1b90._8_8_ = local_1bf0._8_8_;
          local_1ba0 = &local_1b90;
        }
        else {
          local_1ba0 = local_1c00;
        }
        local_1b90._M_allocated_capacity._1_7_ = local_1bf0._M_allocated_capacity._1_7_;
        local_1b90._M_local_buf[0] = local_1bf0._M_local_buf[0];
        local_1b98 = local_1bf8;
        local_1bf8 = (pointer)0x0;
        local_1bf0._M_local_buf[0] = '\0';
        local_1c00 = &local_1bf0;
        std::
        vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  (local_1c10,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1bc0);
        break;
      default:
        goto switchD_001101c2_default;
      }
      if (local_1ba0 != &local_1b90) {
        operator_delete(local_1ba0,local_1b90._M_allocated_capacity + 1);
      }
      if ((long *)local_1bc0._M_allocated_capacity != &local_1bb0) {
        operator_delete((void *)local_1bc0._M_allocated_capacity,local_1bb0 + 1);
      }
      if (local_1c00 != &local_1bf0) {
        operator_delete(local_1c00,
                        CONCAT71(local_1bf0._M_allocated_capacity._1_7_,local_1bf0._M_local_buf[0])
                        + 1);
      }
switchD_001101c2_default:
      if (local_1be0 != local_1bd0) {
        operator_delete(local_1be0,local_1bd0[0] + 1);
      }
    }
    uVar9 = uVar9 + 1;
    if (uVar9 == 5) {
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      return (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1c10;
    }
  } while( true );
}

Assistant:

std::vector<std::pair<std::string, std::string>> GetDefaultMap()
{
	std::vector<std::pair<std::string, std::string>> map;

	map.push_back(std::pair("N", "/[()[]]/"));
	map.push_back(std::pair("N", "\U000000f1"));
	map.push_back(std::pair("N", "|\\|"));
	map.push_back(std::pair("N", "\U00000245\U0000002f"));
	map.push_back(std::pair("N", "/IJ"));
	map.push_back(std::pair("N", "/|/"));

	std::vector<std::string> ns = { "\U000004c5", "\U000003a0", "\U00000418", "\U0001d427", "\U0001d45b", "\U0001d48f", "\U0001d4c3", "\U0001d4f7", "\U0001d52b", "\U0001d55f", "\U0001d593", "\U0001d5c7", "\U0001d5fb", "\U0001d62f", "\U0001d663", "\U0001d697", "\U00000578", "\U0000057c", "\U0000ff2e", "\U00002115", "\U0001d40d", "\U0001d441", "\U0001d475", "\U0001d4a9", "\U0001d4dd", "\U0001d511", "\U0001d579", "\U0001d5ad", "\U0001d5e1", "\U0001d615", "\U0001d649", "\U0001d67d", "\U0000039d", "\U0001d6b4", "\U0001d6ee", "\U0001d728", "\U0001d762", "\U0001d79c", "\U0000a4e0", "\U00000143", "\U00000145", "\U00000147", "\U0000014b", "\U0000019d", "\U000001f8", "\U00000220", "\U0000039d", "\U00001e44", "\U00001e46", "\U00001e48", "\U00001e4a", "\U000020a6", "\U00001f20", "\U00001f21", "\U00001f22", "\U00001f23", "\U00001f24", "\U00001f25", "\U00001f26", "\U00001f27", "\U00001f74", "\U00001f75", "\U00001f90", "\U00001f91", "\U00001f92", "\U00001f93", "\U00001f94", "\U00001f95", "\U00001f96", "\U00001f97", "\U00001fc2", "\U00001fc3", "\U00001fc4", "\U00001fc6", "\U00001fc7", "\U000000f1", "\U00000144", "\U00000146", "\U00000148", "\U00000149", "\U0000014a", "\U0000019e", "\U000001f9", "\U00000235", "\U00000272", "\U00000273", "\U00000274", "\U00001d70", "\U00001d87", "\U00001e45", "\U00001e47", "\U00001e49", "\U00001e4b" };
	std::vector<std::string> is = { "\U00001ec8", "\U00000079", "\U00000069", "\U00000031", "\U0000007c", "\U0000006c", "\U0000006a", "\U00000021", "\U0000002f", "\U0000005c\U0000005c", "\U0000ff49", "\U000000a1", "\U00002170", "\U00002139", "\U00002148", "\U0001d422", "\U0001d456", "\U0001d48a", "\U0001d4be", "\U0001d4f2", "\U0001d526", "\U0001d55a", "\U0001d58e", "\U0001d5c2", "\U0001d5f6", "\U0001d62a", "\U0001d65e", "\U0001d692", "\U00000131", "\U0001d6a4", "\U0000026a", "\U00000269", "\U000003b9", "\U00001fbe", "\U0000037a", "\U0001d6ca", "\U0001d704", "\U0001d73e", "\U0001d778", "\U0001d7b2", "\U00000456", "\U000024be", "\U0000a647", "\U000004cf", "\U0000ab75", "\U000013a5", "\U00000263", "\U00001d8c", "\U0000ff59", "\U0001d432", "\U0001d466", "\U0001d49a", "\U0001d4ce", "\U0001d502", "\U0001d536", "\U0001d56a", "\U0001d59e", "\U0001d5d2", "\U0001d606", "\U0001d63a", "\U0001d66e", "\U0001d6a2", "\U0000028f", "\U00001eff", "\U0000ab5a", "\U000003b3", "\U0000213d", "\U0001d6c4", "\U0001d6fe", "\U0001d738", "\U0001d772", "\U0001d7ac", "\U00000443", "\U000004af", "\U000010e7", "\U0000ff39", "\U0001d418", "\U0001d44c", "\U0001d480", "\U0001d4b4", "\U0001d4e8", "\U0001d51c", "\U0001d550", "\U0001d584", "\U0001d5b8", "\U0001d5ec", "\U0001d620", "\U0001d654", "\U0001d688", "\U000003a5", "\U000003d2", "\U0001d6bc", "\U0001d6f6", "\U0001d730", "\U0001d76a", "\U0001d7a4", "\U00002ca8", "\U00000423", "\U000004ae", "\U000013a9", "\U000013bd", "\U0000a4ec", "\U00000176", "\U00000178", "\U000001b3", "\U00000232", "\U0000024e", "\U0000028f", "\U00001e8e", "\U00001ef2", "\U00001ef4", "\U00001ef6", "\U00001ef8", "\U0000ff39", "\U000000cc", "\U000000cd", "\U000000ce", "\U000000cf", "\U00000128", "\U0000012a", "\U0000012c", "\U0000012e", "\U00000130", "\U00000196", "\U00000197", "\U000001cf", "\U00000208", "\U0000020a", "\U0000026a", "\U0000038a", "\U00000390", "\U00000399", "\U000003aa", "\U00000406", "\U0000040d", "\U00000418", "\U00000419", "\U000004e2", "\U000004e4", "\U00001e2c", "\U00001e2e", "\U00001ec8", "\U00001eca", "\U00001fd8", "\U00001fd9", "\U00002160", "\U0000ff29", "\U000030a7", "\U000030a8", "\U0000ff6a", "\U0000ff74", "\U000000ec", "\U000000ed", "\U000000ee", "\U000000ef", "\U00000129", "\U0000012b", "\U0000012d", "\U0000012f", "\U00000131", "\U000001d0", "\U00000209", "\U0000020b", "\U00000268", "\U00000269", "\U00000365", "\U000003af", "\U000003ca", "\U00000438", "\U00000439", "\U00000456", "\U0000045d", "\U000004e3", "\U000004e5", "\U00001e2d", "\U00001e2f", "\U00001ec9", "\U00001ecb", "\U00001f30", "\U00001f31", "\U00001f32", "\U00001f33", "\U00001f34", "\U00001f35", "\U00001f36", "\U00001f37", "\U00001f76", "\U00001f77", "\U00001fbe", "\U00001fd0", "\U00001fd1", "\U00001fd2", "\U00001fd3", "\U00001fd6", "\U00001fd7", "\U0000ff49", "\U00001d85", "\U00001e37", "\U00001e39", "\U00001e3b", "\U00001e3d", "\U000000fd", "\U000000ff", "\U00000177", "\U000001b4", "\U00000233", "\U0000024f", "\U0000028e", "\U000002b8", "\U00001e8f", "\U00001e99", "\U00001ef3", "\U00001ef5", "\U00001ef7", "\U00001ef9", "\U0000ff59" };
	std::vector<std::string> gs = { "\U0000006b", "\U00000067", "\U00000071", "\U00000034", "\U00000036", "\U00000039", "\U0000011f", "\U00000d6b", "\U0000ff47", "\U0000210a", "\U0001d420", "\U0001d454", "\U0001d488", "\U0001d4f0", "\U0001d524", "\U0001d558", "\U0001d58c", "\U0001d5c0", "\U0001d5f4", "\U0001d628", "\U0001d65c", "\U0001d690", "\U00000261", "\U00001d83", "\U0000018d", "\U00000581", "\U0001d406", "\U0001d43a", "\U0001d46e", "\U0001d4a2", "\U0001d4d6", "\U0001d50a", "\U0001d53e", "\U0001d572", "\U0001d5a6", "\U0001d5da", "\U00004e48", "\U0001d60e", "\U0001d642", "\U0001d676", "\U0000050c", "\U000013c0", "\U000013f3", "\U0000a4d6", "\U0000011c", "\U0000011e", "\U00000120", "\U00000122", "\U00000193", "\U000001e4", "\U000001e6", "\U000001f4", "\U0000029b", "\U00000393", "\U00000413", "\U00001e20", "\U0000ff27", "\U000013b6", "\U0000011d", "\U0000011f", "\U00000121", "\U00000123", "\U000001e5", "\U000001e7", "\U000001f5", "\U00000260", "\U00000261", "\U00000262", "\U00000040" };
	std::vector<std::string> es = { "\U00001ec0", "\U000003a3", "\U0000039e", "\U00000065", "\U00000033", "\U00000075", "\U0000212e", "\U0000ff45", "\U0000212f", "\U00002147", "\U0001d41e", "\U0001d452", "\U0001d486", "\U0001d4ee", "\U0001d522", "\U0001d556", "\U0001d58a", "\U0001d5be", "\U0001d5f2", "\U0001d626", "\U0001d65a", "\U0001d68e", "\U0000ab32", "\U00000435", "\U000004bd", "\U000022ff", "\U0000ff25", "\U00002130", "\U0001d404", "\U0001d438", "\U0001d46c", "\U0001d4d4", "\U0001d508", "\U0001d53c", "\U0001d570", "\U0001d5a4", "\U0001d5d8", "\U0001d60c", "\U0001d640", "\U0001d674", "\U00000395", "\U0001d6ac", "\U0001d6e6", "\U0001d720", "\U0001d75a", "\U0001d794", "\U00000415", "\U00002d39", "\U000013ac", "\U0000a4f0", "\U000000c8", "\U000000c9", "\U000000ca", "\U000000cb", "\U00000112", "\U00000114", "\U00000116", "\U00000118", "\U0000011a", "\U0000018e", "\U00000190", "\U00000204", "\U00000206", "\U00000228", "\U00000246", "\U00000388", "\U0000042d", "\U000004ec", "\U00001e14", "\U00001e16", "\U00001e18", "\U00001e1a", "\U00001e1c", "\U00001eb8", "\U00001eba", "\U00001ebc", "\U00001ebe", "\U00001ec0", "\U00001ec2", "\U00001ec4", "\U00001ec6", "\U00001f18", "\U00001f19", "\U00001f1a", "\U00001f1b", "\U00001f1c", "\U00001f1d", "\U00001fc8", "\U00001fc9", "\U000000e8", "\U000000e9", "\U000000ea", "\U000000eb", "\U00000113", "\U00000115", "\U00000117", "\U00000119", "\U0000011b", "\U0000018f", "\U00000205", "\U00000207", "\U00000229", "\U00000247", "\U00000258", "\U0000025b", "\U0000025c", "\U0000025d", "\U0000025e", "\U00000364", "\U000003ad", "\U000003b5", "\U00000435", "\U0000044d", "\U000004ed", "\U00001e15", "\U00001e17", "\U00001e19", "\U00001e1b", "\U00001e1d", "\U00001eb9", "\U00001ebb", "\U00001ebd", "\U00001ebf", "\U00001ec1", "\U00001ec3", "\U00001ec5", "\U00001ec7", "\U00001f10", "\U00001f11", "\U00001f12", "\U00001f13", "\U00001f14", "\U00001f15", "\U00001f72", "\U00001f73" };
	std::vector<std::string> rs = { "\U00000403", "\U0000042f", "\U00000072", "\U0001d42b", "\U0001d45f", "\U0001d493", "\U0001d4c7", "\U0001d4fb", "\U0001d52f", "\U0001d563", "\U0001d597", "\U0001d5cb", "\U0001d5ff", "\U0001d633", "\U0001d667", "\U0001d69b", "\U0000ab47", "\U0000ab48", "\U00001d26", "\U00002c85", "\U00000433", "\U0000ab81", "\U0000211b", "\U0000211c", "\U0000211d", "\U0001d411", "\U0001d445", "\U0001d479", "\U0001d4e1", "\U0001d57d", "\U0001d5b1", "\U0001d5e5", "\U0001d619", "\U0001d64d", "\U0001d681", "\U000001a6", "\U000013a1", "\U000013d2", "\U000104b4", "\U00001587", "\U0000a4e3", "\U00000154", "\U00000156", "\U00000158", "\U00000210", "\U00000212", "\U0000024c", "\U00000280", "\U00000281", "\U00001e58", "\U00001e5a", "\U00001e5c", "\U00001e5e", "\U00002c64", "\U0000ff32", "\U000013a1", "\U00000155", "\U00000157", "\U00000159", "\U00000211", "\U00000213", "\U0000024d", "\U00000279", "\U0000027a", "\U0000027b", "\U0000027c", "\U0000027d", "\U000016b1", "\U00001875", "\U00001d72", "\U00001d73", "\U00001d89", "\U00001e59", "\U00001e5b", "\U00001e5d", "\U00001e5f", "\U0000ff52" };

	std::vector<std::vector<std::string>> s = { ns, is, gs, es, rs };

	for (auto x = 0;x < 5;x++) {
		for (auto chr : s[x]) {
			switch (x) {
				case 0: map.push_back(std::pair("N", chr)); break;
				case 1: map.push_back(std::pair("I", chr)); break;
				case 2: map.push_back(std::pair("G", chr)); break;
				case 3: map.push_back(std::pair("E", chr)); break;
				case 4: map.push_back(std::pair("R", chr)); break;
			}
		}
	}

	return map;
}